

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O2

bool tinyusdz::tydra::GetProperty(Prim *prim,string *attr_name,Property *out_prop,string *err)

{
  vtable_type **ppvVar1;
  _Alloc_hider _Var2;
  double dVar3;
  char cVar4;
  vtable_type *pvVar5;
  pointer pXVar6;
  pointer pSVar7;
  pointer pSVar8;
  pointer pSVar9;
  pointer pSVar10;
  pointer pSVar11;
  pointer pSVar12;
  pointer pSVar13;
  pointer pSVar14;
  pointer pSVar15;
  pointer pSVar16;
  pointer pSVar17;
  bool bVar18;
  __type _Var19;
  uint32_t uVar20;
  ListEditQual LVar21;
  Model *pMVar22;
  const_iterator cVar23;
  Xformable *this;
  error_type *peVar24;
  Scope *pSVar25;
  value_type_conflict *pvVar26;
  ostream *poVar27;
  GeomMesh *pGVar28;
  value_type *pvVar29;
  vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>::Sample>_>
  *pvVar30;
  GeomSubset *this_00;
  ElementType *pEVar31;
  value_type *value;
  Shader *pSVar32;
  UsdPrimvarReader<float> *pUVar33;
  Material *pMVar34;
  value_type *pvVar35;
  vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>::Sample>_>
  *pvVar36;
  value_type *pvVar37;
  vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>::Sample>_>
  *pvVar38;
  SkelRoot *pSVar39;
  UsdPrimvarReader<std::array<float,_2UL>_> *pUVar40;
  BlendShape *pBVar41;
  UsdPrimvarReader<std::array<float,_4UL>_> *pUVar42;
  Skeleton *pSVar43;
  UsdTransform2d *pUVar44;
  SkelAnimation *pSVar45;
  vector<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary>::Sample>_>
  *pvVar46;
  value_type *value_00;
  UsdUVTexture *pUVar47;
  value_type *pvVar48;
  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample>_>
  *pvVar49;
  SubdivisionScheme *pSVar50;
  UsdPreviewSurface *pUVar51;
  vector<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::Sample>_>
  *pvVar52;
  value_type *pvVar53;
  value_type *pvVar54;
  vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
  *pvVar55;
  Animatable<int> *pAVar56;
  vector<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
  *pvVar57;
  value_type *pvVar58;
  vector<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
  *pvVar59;
  value_type *pvVar60;
  vector<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
  *pvVar61;
  Animatable<tinyusdz::value::normal3f> *pAVar62;
  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
  *pvVar63;
  ElementType v;
  InterpolateBoundary extraout_EDX;
  SubdivisionScheme v_00;
  InterpolateBoundary extraout_EDX_00;
  InterpolateBoundary v_01;
  FaceVaryingLinearInterpolation extraout_EDX_01;
  FaceVaryingLinearInterpolation extraout_EDX_02;
  FaceVaryingLinearInterpolation v_02;
  OpType *extraout_RDX;
  OpType *op;
  OpType *extraout_RDX_00;
  string *err_00;
  string *extraout_RDX_01;
  string *extraout_RDX_02;
  string *extraout_RDX_03;
  string *extraout_RDX_04;
  string *extraout_RDX_05;
  string *err_01;
  string *extraout_RDX_06;
  string *extraout_RDX_07;
  string *extraout_RDX_08;
  char *pcVar64;
  string *err_02;
  string *extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 uVar65;
  undefined8 extraout_RDX_13;
  string *err_03;
  string *psVar66;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pTVar67;
  size_t i_7;
  pointer this_01;
  Value *this_02;
  int iVar68;
  PrimVar *pPVar69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *pTVar70;
  long lVar71;
  undefined1 uVar72;
  size_t i;
  ulong uVar73;
  AttrMetas *local_9f0;
  PrimVar pvar;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> toks;
  bool local_978;
  TimeSamples ts_1;
  AttrMetas *local_940;
  AttrMetas *local_938;
  allocator local_929;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8f8;
  string err_1;
  AttrMetas *local_8c0;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  string local_890 [56];
  bool local_858;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_830;
  AttrMetas local_818;
  ostringstream ss_e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_600;
  TimeSamples local_5f0 [46];
  
  pvVar5 = (prim->_data).v_.vtable;
  if (pvVar5 == (vtable_type *)0x0) {
LAB_002893f3:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar27 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar27 = ::std::operator<<(poVar27,
                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                               );
    poVar27 = ::std::operator<<(poVar27,":");
    poVar27 = ::std::operator<<(poVar27,"GetProperty");
    poVar27 = ::std::operator<<(poVar27,"():");
    poVar27 = (ostream *)::std::ostream::operator<<(poVar27,0x79a);
    ::std::operator<<(poVar27," ");
    poVar27 = ::std::operator<<((ostream *)&ss_e,"TODO: Prim type ");
    linb::any::type_name_abi_cxx11_((string *)&ret,&(prim->_data).v_);
    poVar27 = ::std::operator<<(poVar27,(string *)&ret);
    ::std::operator<<(poVar27,"\n");
    ::std::__cxx11::string::_M_dispose();
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    return false;
  }
  psVar66 = err;
  uVar20 = (*pvVar5->type_id)();
  if (uVar20 == 0x401) {
    pMVar22 = Prim::as<tinyusdz::Model>(prim);
    if (out_prop != (Property *)0x0) {
      cVar23 = ::std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                       *)&pMVar22->props,attr_name);
      if ((_Rb_tree_header *)cVar23._M_node == &(pMVar22->props)._M_t._M_impl.super__Rb_tree_header)
      {
        ret.contained.
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .m_has_value = true;
        ret.contained.
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_error._M_dataplus._M_p =
             (_Alloc_hider)
             ((ulong)ret.contained.
                     super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .field_0.m_error._M_dataplus._M_p & 0xffffffffffffff00);
      }
      else {
        Property::operator=(out_prop,(Property *)(cVar23._M_node + 2));
        ret.contained.
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .m_has_value = true;
        ret.contained.
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_value = true;
      }
LAB_002869a9:
      pvVar26 = nonstd::expected_lite::
                expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::value(&ret);
      if (*pvVar26 != false) {
LAB_002869bb:
        pPVar69 = (PrimVar *)&ret;
LAB_002869c3:
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)pPVar69);
        return true;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar27 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar27 = ::std::operator<<(poVar27,
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                 );
      poVar27 = ::std::operator<<(poVar27,":");
      poVar27 = ::std::operator<<(poVar27,"GetProperty");
      poVar27 = ::std::operator<<(poVar27,"():");
      poVar27 = (ostream *)::std::ostream::operator<<(poVar27,0x78f);
      ::std::operator<<(poVar27," ");
      ::std::__cxx11::string::string
                ((string *)&ret_1,"Attribute `{}` does not exist in Prim {}({})",(allocator *)&ts_1)
      ;
      tinyusdz::value::TypeTraits<tinyusdz::Model>::type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                ((string *)&pvar,(fmt *)&ret_1,attr_name,&(prim->_elementPath)._prim_part,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&toks,in_R9);
      goto LAB_00286a98;
    }
    _ss_e = "[InternalError] nullptr in output Property is not allowed.";
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(&ret,(unexpected_type<const_char_*> *)&ss_e);
    if ((ret.contained.
         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._32_4_ & 1) != 0) goto LAB_002869a9;
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar27 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar27 = ::std::operator<<(poVar27,
                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                               );
    poVar27 = ::std::operator<<(poVar27,":");
    poVar27 = ::std::operator<<(poVar27,"GetProperty");
    poVar27 = ::std::operator<<(poVar27,"():");
    iVar68 = 0x78f;
LAB_002868c4:
    poVar27 = (ostream *)::std::ostream::operator<<(poVar27,iVar68);
    ::std::operator<<(poVar27," ");
    peVar24 = nonstd::expected_lite::
              expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::error(&ret);
    poVar27 = ::std::operator<<((ostream *)&ss_e,(string *)peVar24);
    ::std::operator<<(poVar27,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      goto LAB_00286ae4;
    }
  }
  else {
    pvVar5 = (prim->_data).v_.vtable;
    if (pvVar5 == (vtable_type *)0x0) goto LAB_002893f3;
    uVar20 = (*pvVar5->type_id)();
    if (uVar20 == 0x404) {
      this = (Xformable *)Prim::as<tinyusdz::Xform>(prim);
      if (out_prop == (Property *)0x0) {
        _ss_e = "[InternalError] nullptr in output Property is not allowed.";
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::expected<const_char_*,_0>(&ret_1,(unexpected_type<const_char_*> *)&ss_e);
      }
      else {
        bVar18 = ::std::operator==(attr_name,"xformOpOrder");
        if (bVar18) {
          Xformable::xformOpOrder(&toks,this);
          linb::any::construct<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>const&>
                    ((any *)&ts_1,&toks);
          pvar._value.v_.vtable._0_1_ = 0x60;
          pvar._value.v_.vtable._1_7_ = 0x3f04;
          pvar._value.v_.storage.dynamic = (void *)0x0;
          pvar._blocked = false;
          pvar._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
          pvar._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start._1_7_ = 0;
          pvar._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
          pvar._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
          pvar._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          pvar._ts._17_8_ = 0;
          linb::any::operator=((any *)&pvar,&toks);
          Attribute::Attribute((Attribute *)&ret);
          Attribute::set_var((Attribute *)&ret,&pvar);
          ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value = true;
          ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._33_3_ = 0;
          Property::Property((Property *)&ss_e);
          Property::set_attribute((Property *)&ss_e,(Attribute *)&ret);
          Property::operator=(out_prop,(Property *)&ss_e);
          Property::~Property((Property *)&ss_e);
          Attribute::~Attribute((Attribute *)&ret);
          primvar::PrimVar::~PrimVar(&pvar);
          if (CONCAT71(ts_1._samples.
                       super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                       ts_1._samples.
                       super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) != 0) {
            (**(code **)(CONCAT71(ts_1._samples.
                                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                  ts_1._samples.
                                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) + 0x20))
                      (&ts_1);
          }
          ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&toks);
        }
        else {
          pXVar6 = (this->xformOps).
                   super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl
                   .super__Vector_impl_data._M_finish;
          op = extraout_RDX;
          for (this_01 = (this->xformOps).
                         super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>.
                         _M_impl.super__Vector_impl_data._M_start; this_01 != pXVar6;
              this_01 = this_01 + 1) {
            tinyusdz::to_string_abi_cxx11_((string *)&toks,(tinyusdz *)this_01,op);
            if ((this_01->suffix)._M_string_length != 0) {
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ss_e,":",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &this_01->suffix);
              ::std::__cxx11::string::append((string *)&toks);
              ::std::__cxx11::string::_M_dispose();
            }
            _Var19 = ::std::operator==((string *)&toks,attr_name);
            if (_Var19) {
              pvar._value.v_.vtable._0_1_ = 0x60;
              pvar._value.v_.vtable._1_7_ = 0x3f04;
              pvar._value.v_.storage.dynamic = (void *)0x0;
              pvar._blocked = false;
              pvar._ts._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
              pvar._ts._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_start._1_7_ = 0;
              pvar._ts._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
              pvar._ts._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
              pvar._ts._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
              pvar._ts._17_8_ = 0;
              Attribute::Attribute((Attribute *)&ret);
              uVar72 = 0;
              if (this_01->op_type < ResetXformStack) {
                primvar::PrimVar::operator=(&pvar,&this_01->_var);
LAB_00286ef5:
                Attribute::set_var((Attribute *)&ret,&pvar);
                Property::Property((Property *)&ss_e,(Attribute *)&ret,false);
                Property::operator=(out_prop,(Property *)&ss_e);
                Property::~Property((Property *)&ss_e);
                uVar72 = 1;
              }
              else if (this_01->op_type != ResetXformStack) goto LAB_00286ef5;
              Attribute::~Attribute((Attribute *)&ret);
              primvar::PrimVar::~PrimVar(&pvar);
              ret_1.contained.
              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .m_has_value = true;
              ret_1.contained.
              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0.m_value = (value_type_conflict)uVar72;
              ::std::__cxx11::string::_M_dispose();
              goto LAB_002874a3;
            }
            ::std::__cxx11::string::_M_dispose();
            op = extraout_RDX_00;
          }
          cVar23 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                           *)(this[0x28]._matrix.m[2] + 2),attr_name);
          if (cVar23._M_node == (_Base_ptr)(this[0x28]._matrix.m[2] + 3)) {
            ret_1.contained.
            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .m_has_value = true;
            ret_1.contained.
            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .field_0.m_error._M_dataplus._M_p =
                 (_Alloc_hider)
                 ((ulong)ret_1.contained.
                         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .field_0.m_error._M_dataplus._M_p & 0xffffffffffffff00);
            goto LAB_002874a3;
          }
          Property::operator=(out_prop,(Property *)(cVar23._M_node + 2));
        }
        ret_1.contained.
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .m_has_value = true;
        ret_1.contained.
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_value = true;
      }
LAB_002874a3:
      if (ret_1.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar26 = nonstd::expected_lite::
                  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::value(&ret_1);
        if (*pvVar26 != false) {
LAB_002874c3:
          pPVar69 = (PrimVar *)&ret_1;
          goto LAB_002869c3;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar27 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar27 = ::std::operator<<(poVar27,
                                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                   );
        poVar27 = ::std::operator<<(poVar27,":");
        poVar27 = ::std::operator<<(poVar27,"GetProperty");
        poVar27 = ::std::operator<<(poVar27,"():");
        poVar27 = (ostream *)::std::ostream::operator<<(poVar27,0x790);
        ::std::operator<<(poVar27," ");
        ::std::__cxx11::string::string
                  ((string *)&pvar,"Attribute `{}` does not exist in Prim {}({})",(allocator *)&ts_1
                  );
        tinyusdz::value::TypeTraits<tinyusdz::Xform>::type_name_abi_cxx11_();
LAB_00287641:
        fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  ((string *)&ret,(fmt *)&pvar,attr_name,&(prim->_elementPath)._prim_part,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&toks,in_R9)
        ;
        poVar27 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
        ::std::operator<<(poVar27,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          goto LAB_002876b2;
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar27 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar27 = ::std::operator<<(poVar27,
                                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                   );
        poVar27 = ::std::operator<<(poVar27,":");
        poVar27 = ::std::operator<<(poVar27,"GetProperty");
        poVar27 = ::std::operator<<(poVar27,"():");
        iVar68 = 0x790;
LAB_00287533:
        poVar27 = (ostream *)::std::ostream::operator<<(poVar27,iVar68);
        ::std::operator<<(poVar27," ");
        peVar24 = nonstd::expected_lite::
                  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::error(&ret_1);
        poVar27 = ::std::operator<<((ostream *)&ss_e,(string *)peVar24);
        ::std::operator<<(poVar27,"\n");
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
LAB_002876b2:
          ::std::__cxx11::string::append((string *)err);
          ::std::__cxx11::string::_M_dispose();
        }
      }
LAB_002876c2:
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
      pPVar69 = (PrimVar *)&ret_1;
      goto LAB_002876d7;
    }
    pvVar5 = (prim->_data).v_.vtable;
    if (pvVar5 == (vtable_type *)0x0) goto LAB_002893f3;
    uVar20 = (*pvVar5->type_id)();
    if (uVar20 != 0x402) {
      pvVar5 = (prim->_data).v_.vtable;
      if (pvVar5 == (vtable_type *)0x0) goto LAB_002893f3;
      uVar20 = (*pvVar5->type_id)();
      if (uVar20 == 0x405) {
        pGVar28 = Prim::as<tinyusdz::GeomMesh>(prim);
        if (out_prop == (Property *)0x0) {
          _ss_e = "[InternalError] nullptr in output Property is not allowed.";
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::expected<const_char_*,_0>(&ret_1,(unexpected_type<const_char_*> *)&ss_e);
        }
        else {
          err_1._M_dataplus._M_p = (pointer)&err_1.field_2;
          err_1._M_string_length = 0;
          err_1.field_2._M_allocated_capacity =
               err_1.field_2._M_allocated_capacity & 0xffffffffffffff00;
          bVar18 = ::std::operator==(attr_name,"points");
          if (bVar18) {
            Attribute::Attribute((Attribute *)&ret);
            ret.contained.
            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .m_has_value = false;
            ret.contained.
            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._33_3_ = 0;
            tinyusdz::value::
            TypeTraits<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
            ::type_name_abi_cxx11_();
            ::std::__cxx11::string::_M_assign(local_890);
            ::std::__cxx11::string::_M_dispose();
            if ((pGVar28->points)._blocked == true) {
              local_858 = true;
            }
            if ((pGVar28->points)._paths.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                (pGVar28->points)._paths.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_start) {
              ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        (&local_830,&(pGVar28->points)._paths);
            }
            local_940 = &(pGVar28->points)._metas;
            pvar._value.v_.vtable._0_1_ = 0x60;
            pvar._value.v_.vtable._1_7_ = 0x3f04;
            pvar._value.v_.storage.dynamic = (void *)0x0;
            pvar._blocked = false;
            pvar._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
            pvar._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start._1_7_ = 0;
            pvar._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
            pvar._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
            pvar._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
            pvar._ts._17_8_ = 0;
            nonstd::optional_lite::
            optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
            ::optional((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                        *)&ss_e,&(pGVar28->points)._attrib);
            if (ss_e == (ostringstream)0x1) {
              pvVar29 = nonstd::optional_lite::
                        optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                        ::value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                                 *)&ss_e);
              if (pvVar29->_blocked == true) {
                local_858 = true;
              }
              pvVar29 = nonstd::optional_lite::
                        optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                        ::value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                                 *)&ss_e);
              if (pvVar29->_has_value == true) {
                toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_finish._0_1_ = 0;
                toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_finish._1_7_ = 0;
                toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
                pvVar29 = nonstd::optional_lite::
                          optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                          ::value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                                   *)&ss_e);
                bVar18 = Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
                         ::get_scalar(pvVar29,(vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                               *)&toks);
                if (bVar18) {
                  linb::any::
                  construct<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>const&>
                            ((any *)&ts_1,
                             (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                              *)&toks);
                  linb::any::operator=((any *)&pvar,(any *)&ts_1);
                  if (CONCAT71(ts_1._samples.
                               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                               ts_1._samples.
                               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) != 0) {
                    (**(code **)(CONCAT71(ts_1._samples.
                                          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                          ts_1._samples.
                                          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_)
                                + 0x20))(&ts_1);
                  }
                }
                ::std::
                _Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
                ~_Vector_base((_Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                               *)&toks);
              }
              pvVar29 = nonstd::optional_lite::
                        optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                        ::value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                                 *)&ss_e);
              bVar18 = Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
                       ::has_timesamples(pvVar29);
              if (bVar18) {
                pvVar29 = nonstd::optional_lite::
                          optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                          ::value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                                   *)&ss_e);
                pvVar30 = TypedTimeSamples<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
                          ::get_samples(&pvVar29->_ts);
                toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_finish._0_1_ = 0;
                toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_finish._1_7_ = 0;
                toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
                lVar71 = 8;
                for (uVar73 = 0;
                    pSVar7 = (pvVar30->
                             super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>::Sample>_>
                             )._M_impl.super__Vector_impl_data._M_start,
                    uVar73 < (ulong)(((long)(pvVar30->
                                            super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>::Sample>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pSVar7) / 0x28); uVar73 = uVar73 + 1) {
                  dVar3 = *(double *)((long)pSVar7 + lVar71 + -8);
                  linb::any::
                  construct<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>const&>
                            ((any *)&ts_1,
                             (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                              *)((long)&pSVar7->t + lVar71));
                  tinyusdz::value::TimeSamples::add_sample
                            ((TimeSamples *)&toks,dVar3,(Value *)&ts_1);
                  if (CONCAT71(ts_1._samples.
                               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                               ts_1._samples.
                               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) != 0) {
                    (**(code **)(CONCAT71(ts_1._samples.
                                          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                          ts_1._samples.
                                          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_)
                                + 0x20))(&ts_1);
                  }
                  lVar71 = lVar71 + 0x28;
                }
                tinyusdz::value::TimeSamples::operator=(&pvar._ts,(TimeSamples *)&toks);
                ::std::
                vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           *)&toks);
              }
              pvVar29 = nonstd::optional_lite::
                        optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                        ::value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                                 *)&ss_e);
              if (pvVar29->_has_value == false) {
                pvVar29 = nonstd::optional_lite::
                          optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                          ::value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                                   *)&ss_e);
                bVar18 = Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
                         ::has_timesamples(pvVar29);
                if (!bVar18) goto LAB_0028798e;
              }
              Attribute::set_var((Attribute *)&ret,&pvar);
            }
LAB_0028798e:
            nonstd::optional_lite::
            optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
            ::~optional((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                         *)&ss_e);
            goto LAB_0028799b;
          }
          bVar18 = ::std::operator==(attr_name,"faceVertexCounts");
          psVar66 = extraout_RDX_01;
          if ((bVar18) ||
             (bVar18 = ::std::operator==(attr_name,"faceVertexIndices"), psVar66 = extraout_RDX_02,
             bVar18)) {
            pTVar70 = &pGVar28->faceVertexCounts;
LAB_00287739:
            (anonymous_namespace)::ToProperty<std::vector<int,std::allocator<int>>>
                      (pTVar70,out_prop,psVar66);
            goto LAB_002879f2;
          }
          bVar18 = ::std::operator==(attr_name,"normals");
          if (bVar18) {
            Attribute::Attribute((Attribute *)&ret);
            ret.contained.
            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .m_has_value = false;
            ret.contained.
            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._33_3_ = 0;
            tinyusdz::value::
            TypeTraits<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
            ::type_name_abi_cxx11_();
            ::std::__cxx11::string::_M_assign(local_890);
            ::std::__cxx11::string::_M_dispose();
            if ((pGVar28->normals)._blocked == true) {
              local_858 = true;
            }
            if ((pGVar28->normals)._paths.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                (pGVar28->normals)._paths.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_start) {
              ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        (&local_830,&(pGVar28->normals)._paths);
            }
            local_940 = &(pGVar28->normals)._metas;
            pvar._value.v_.vtable._0_1_ = 0x60;
            pvar._value.v_.vtable._1_7_ = 0x3f04;
            pvar._value.v_.storage.dynamic = (void *)0x0;
            pvar._blocked = false;
            pvar._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
            pvar._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start._1_7_ = 0;
            pvar._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
            pvar._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
            pvar._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
            pvar._ts._17_8_ = 0;
            nonstd::optional_lite::
            optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
            ::optional((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                        *)&ss_e,&(pGVar28->normals)._attrib);
            if (ss_e == (ostringstream)0x1) {
              pvVar35 = nonstd::optional_lite::
                        optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                        ::value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                                 *)&ss_e);
              if (pvVar35->_blocked == true) {
                local_858 = true;
              }
              pvVar35 = nonstd::optional_lite::
                        optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                        ::value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                                 *)&ss_e);
              if (pvVar35->_has_value == true) {
                toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_finish._0_1_ = 0;
                toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_finish._1_7_ = 0;
                toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
                pvVar35 = nonstd::optional_lite::
                          optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                          ::value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                                   *)&ss_e);
                bVar18 = Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>
                         ::get_scalar(pvVar35,(vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                               *)&toks);
                if (bVar18) {
                  linb::any::
                  construct<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>const&>
                            ((any *)&ts_1,
                             (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                              *)&toks);
                  linb::any::operator=((any *)&pvar,(any *)&ts_1);
                  if (CONCAT71(ts_1._samples.
                               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                               ts_1._samples.
                               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) != 0) {
                    (**(code **)(CONCAT71(ts_1._samples.
                                          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                          ts_1._samples.
                                          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_)
                                + 0x20))(&ts_1);
                  }
                }
                ::std::
                _Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                ::~_Vector_base((_Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                 *)&toks);
              }
              pvVar35 = nonstd::optional_lite::
                        optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                        ::value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                                 *)&ss_e);
              bVar18 = Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>
                       ::has_timesamples(pvVar35);
              if (bVar18) {
                pvVar35 = nonstd::optional_lite::
                          optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                          ::value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                                   *)&ss_e);
                pvVar36 = TypedTimeSamples<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>
                          ::get_samples(&pvVar35->_ts);
                toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_finish._0_1_ = 0;
                toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_finish._1_7_ = 0;
                toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
                lVar71 = 8;
                for (uVar73 = 0;
                    pSVar8 = (pvVar36->
                             super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>::Sample>_>
                             )._M_impl.super__Vector_impl_data._M_start,
                    uVar73 < (ulong)(((long)(pvVar36->
                                            super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>::Sample>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pSVar8) / 0x28); uVar73 = uVar73 + 1) {
                  dVar3 = *(double *)((long)pSVar8 + lVar71 + -8);
                  linb::any::
                  construct<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>const&>
                            ((any *)&ts_1,
                             (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                              *)((long)&pSVar8->t + lVar71));
                  tinyusdz::value::TimeSamples::add_sample
                            ((TimeSamples *)&toks,dVar3,(Value *)&ts_1);
                  if (CONCAT71(ts_1._samples.
                               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                               ts_1._samples.
                               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) != 0) {
                    (**(code **)(CONCAT71(ts_1._samples.
                                          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                          ts_1._samples.
                                          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_)
                                + 0x20))(&ts_1);
                  }
                  lVar71 = lVar71 + 0x28;
                }
                tinyusdz::value::TimeSamples::operator=(&pvar._ts,(TimeSamples *)&toks);
                ::std::
                vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           *)&toks);
              }
              pvVar35 = nonstd::optional_lite::
                        optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                        ::value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                                 *)&ss_e);
              if (pvVar35->_has_value == false) {
                pvVar35 = nonstd::optional_lite::
                          optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                          ::value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                                   *)&ss_e);
                bVar18 = Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>
                         ::has_timesamples(pvVar35);
                if (!bVar18) goto LAB_00288498;
              }
              Attribute::set_var((Attribute *)&ret,&pvar);
            }
LAB_00288498:
            nonstd::optional_lite::
            optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
            ::~optional((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                         *)&ss_e);
LAB_0028799b:
            primvar::PrimVar::~PrimVar(&pvar);
            AttrMetas::operator=(&local_818,local_940);
            Property::Property((Property *)&ss_e,(Attribute *)&ret,false);
            Property::operator=(out_prop,(Property *)&ss_e);
            Property::~Property((Property *)&ss_e);
            Attribute::~Attribute((Attribute *)&ret);
LAB_002879f2:
            ret_1.contained.
            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .m_has_value = true;
            ret_1.contained.
            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .field_0.m_value = true;
          }
          else {
            bVar18 = ::std::operator==(attr_name,"velocities");
            if (bVar18) {
              Attribute::Attribute((Attribute *)&ret);
              ret.contained.
              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .m_has_value = false;
              ret.contained.
              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._33_3_ = 0;
              tinyusdz::value::
              TypeTraits<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
              ::type_name_abi_cxx11_();
              ::std::__cxx11::string::_M_assign(local_890);
              ::std::__cxx11::string::_M_dispose();
              if ((pGVar28->velocities)._blocked == true) {
                local_858 = true;
              }
              if ((pGVar28->velocities)._paths.
                  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  (pGVar28->velocities)._paths.
                  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                          (&local_830,&(pGVar28->velocities)._paths);
              }
              local_940 = &(pGVar28->velocities)._metas;
              pvar._value.v_.vtable._0_1_ = 0x60;
              pvar._value.v_.vtable._1_7_ = 0x3f04;
              pvar._value.v_.storage.dynamic = (void *)0x0;
              pvar._blocked = false;
              pvar._ts._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
              pvar._ts._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_start._1_7_ = 0;
              pvar._ts._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
              pvar._ts._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
              pvar._ts._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
              pvar._ts._17_8_ = 0;
              nonstd::optional_lite::
              optional<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
              ::optional((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                          *)&ss_e,&(pGVar28->velocities)._attrib);
              if (ss_e == (ostringstream)0x1) {
                pvVar37 = nonstd::optional_lite::
                          optional<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                          ::value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                                   *)&ss_e);
                if (pvVar37->_blocked == true) {
                  local_858 = true;
                }
                pvVar37 = nonstd::optional_lite::
                          optional<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                          ::value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                                   *)&ss_e);
                if (pvVar37->_has_value == true) {
                  toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                  .super__Vector_impl_data._M_start = (pointer)0x0;
                  toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                  .super__Vector_impl_data._M_finish._0_1_ = 0;
                  toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                  .super__Vector_impl_data._M_finish._1_7_ = 0;
                  toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                  toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
                  pvVar37 = nonstd::optional_lite::
                            optional<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                            ::value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                                     *)&ss_e);
                  bVar18 = Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>
                           ::get_scalar(pvVar37,(vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                                 *)&toks);
                  if (bVar18) {
                    linb::any::
                    construct<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>const&>
                              ((any *)&ts_1,
                               (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                *)&toks);
                    linb::any::operator=((any *)&pvar,(any *)&ts_1);
                    if (CONCAT71(ts_1._samples.
                                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                 ts_1._samples.
                                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) != 0) {
                      (**(code **)(CONCAT71(ts_1._samples.
                                            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_
                                            ,ts_1._samples.
                                             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                             _0_1_) + 0x20))(&ts_1);
                    }
                  }
                  ::std::
                  _Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                  ::~_Vector_base((_Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                   *)&toks);
                }
                pvVar37 = nonstd::optional_lite::
                          optional<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                          ::value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                                   *)&ss_e);
                bVar18 = Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>
                         ::has_timesamples(pvVar37);
                if (bVar18) {
                  pvVar37 = nonstd::optional_lite::
                            optional<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                            ::value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                                     *)&ss_e);
                  pvVar38 = TypedTimeSamples<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>
                            ::get_samples(&pvVar37->_ts);
                  toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                  .super__Vector_impl_data._M_start = (pointer)0x0;
                  toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                  .super__Vector_impl_data._M_finish._0_1_ = 0;
                  toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                  .super__Vector_impl_data._M_finish._1_7_ = 0;
                  toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                  toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
                  lVar71 = 8;
                  for (uVar73 = 0;
                      pSVar9 = (pvVar38->
                               super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>::Sample>_>
                               )._M_impl.super__Vector_impl_data._M_start,
                      uVar73 < (ulong)(((long)(pvVar38->
                                              super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>::Sample>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pSVar9) / 0x28); uVar73 = uVar73 + 1) {
                    dVar3 = *(double *)((long)pSVar9 + lVar71 + -8);
                    linb::any::
                    construct<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>const&>
                              ((any *)&ts_1,
                               (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                *)((long)&pSVar9->t + lVar71));
                    tinyusdz::value::TimeSamples::add_sample
                              ((TimeSamples *)&toks,dVar3,(Value *)&ts_1);
                    if (CONCAT71(ts_1._samples.
                                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                 ts_1._samples.
                                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) != 0) {
                      (**(code **)(CONCAT71(ts_1._samples.
                                            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_
                                            ,ts_1._samples.
                                             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                             _0_1_) + 0x20))(&ts_1);
                    }
                    lVar71 = lVar71 + 0x28;
                  }
                  tinyusdz::value::TimeSamples::operator=(&pvar._ts,(TimeSamples *)&toks);
                  ::std::
                  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                             *)&toks);
                }
                pvVar37 = nonstd::optional_lite::
                          optional<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                          ::value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                                   *)&ss_e);
                if (pvVar37->_has_value == false) {
                  pvVar37 = nonstd::optional_lite::
                            optional<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                            ::value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                                     *)&ss_e);
                  bVar18 = Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>
                           ::has_timesamples(pvVar37);
                  if (!bVar18) goto LAB_00288b2e;
                }
                Attribute::set_var((Attribute *)&ret,&pvar);
              }
LAB_00288b2e:
              nonstd::optional_lite::
              optional<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
              ::~optional((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                           *)&ss_e);
              goto LAB_0028799b;
            }
            bVar18 = ::std::operator==(attr_name,"cornerIndices");
            if (bVar18) {
              pTVar70 = &pGVar28->cornerIndices;
              psVar66 = extraout_RDX_05;
              goto LAB_00287739;
            }
            bVar18 = ::std::operator==(attr_name,"cornerSharpnesses");
            if (bVar18) {
              (anonymous_namespace)::ToProperty<std::vector<float,std::allocator<float>>>
                        (&pGVar28->cornerSharpnesses,out_prop,err_01);
              goto LAB_002879f2;
            }
            bVar18 = ::std::operator==(attr_name,"creaseIndices");
            if (bVar18) {
              pTVar70 = &pGVar28->creaseIndices;
              psVar66 = extraout_RDX_07;
LAB_00288b69:
              (anonymous_namespace)::ToProperty<std::vector<int,std::allocator<int>>>
                        (pTVar70,out_prop,psVar66);
              goto LAB_002879f2;
            }
            bVar18 = ::std::operator==(attr_name,"creaseSharpnesses");
            if (bVar18) {
              (anonymous_namespace)::ToProperty<std::vector<float,std::allocator<float>>>
                        (&pGVar28->creaseSharpnesses,out_prop,err_02);
              goto LAB_002879f2;
            }
            bVar18 = ::std::operator==(attr_name,"holeIndices");
            if (bVar18) {
              pTVar70 = &pGVar28->holeIndices;
              psVar66 = extraout_RDX_09;
              goto LAB_00288b69;
            }
            bVar18 = ::std::operator==(attr_name,"interpolateBoundary");
            if (!bVar18) {
              bVar18 = ::std::operator==(attr_name,"subdivisionScheme");
              if (!bVar18) {
                bVar18 = ::std::operator==(attr_name,"faceVaryingLinearInterpolation");
                if (!bVar18) {
                  bVar18 = ::std::operator==(attr_name,"skeleton");
                  if (bVar18) {
                    if ((pGVar28->skeleton).has_value_ != true) {
LAB_0028ad45:
                      ret_1.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value = true;
                      ret_1.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .field_0.m_error._M_dataplus._M_p =
                           (_Alloc_hider)
                           ((ulong)ret_1.contained.
                                   super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   .field_0.m_error._M_dataplus._M_p & 0xffffffffffffff00);
                      goto LAB_00287a02;
                    }
                    pvVar53 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                                        (&pGVar28->skeleton);
                    Property::Property((Property *)&ss_e,pvVar53,false);
                    Property::operator=(out_prop,(Property *)&ss_e);
                    Property::~Property((Property *)&ss_e);
                  }
                  else {
                    cVar23 = ::std::
                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                     *)&(pGVar28->super_GPrim).props,attr_name);
                    if ((_Rb_tree_header *)cVar23._M_node ==
                        &(pGVar28->super_GPrim).props._M_t._M_impl.super__Rb_tree_header)
                    goto LAB_0028ad45;
                    Property::operator=(out_prop,(Property *)(cVar23._M_node + 2));
                  }
                  goto LAB_002879f2;
                }
                Attribute::Attribute((Attribute *)&ret);
                ret.contained.
                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .m_has_value = false;
                ret.contained.
                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._33_3_ = 0;
                ::std::__cxx11::string::string((string *)&ss_e,"token",(allocator *)&pvar);
                ::std::__cxx11::string::_M_assign(local_890);
                ::std::__cxx11::string::_M_dispose();
                if ((pGVar28->faceVaryingLinearInterpolation)._blocked == true) {
                  local_858 = true;
                }
                local_8c0 = &(pGVar28->faceVaryingLinearInterpolation)._metas;
                if ((pGVar28->faceVaryingLinearInterpolation)._paths.
                    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                    super__Vector_impl_data._M_finish !=
                    (pGVar28->faceVaryingLinearInterpolation)._paths.
                    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                    super__Vector_impl_data._M_start) {
                  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                            (&local_830,&(pGVar28->faceVaryingLinearInterpolation)._paths);
                }
                local_940 = (AttrMetas *)
                            TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>_>
                            ::get_value((TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>_>
                                         *)local_8c0);
                local_600._M_allocated_capacity =
                     (size_type)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
                _ss_e = (char *)0x0;
                local_600._8_8_ = local_600._8_8_ & 0xffffffffffffff00;
                local_5f0[0]._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_5f0[0]._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                local_5f0[0]._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                local_5f0[0]._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                local_5f0[0]._17_8_ = 0;
                bVar18 = Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::
                         has_timesamples((Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>
                                          *)local_940);
                v_02 = extraout_EDX_01;
                if (bVar18) {
                  pvVar52 = TypedTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::
                            get_samples((TypedTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>
                                         *)&((Animatable<tinyusdz::GeomMesh::InterpolateBoundary> *)
                                            local_940)->_ts);
                  ts_1._samples.
                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  ts_1._samples.
                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                  ts_1._samples.
                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                  ts_1._samples.
                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                  ts_1._samples.
                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
                  ts_1._dirty = false;
                  lVar71 = 0;
                  uVar65 = extraout_RDX_12;
                  for (uVar73 = 0;
                      pSVar12 = (pvVar52->
                                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::Sample>_>
                                )._M_impl.super__Vector_impl_data._M_start,
                      uVar73 < (ulong)((long)(pvVar52->
                                             super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::Sample>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pSVar12 >> 4); uVar73 = uVar73 + 1) {
                    tinyusdz::to_string_abi_cxx11_
                              ((string *)&toks,
                               (tinyusdz *)(ulong)*(uint *)((long)&pSVar12->value + lVar71),
                               (FaceVaryingLinearInterpolation)uVar65);
                    Token::Token((Token *)&pvar,(string *)&toks);
                    ::std::__cxx11::string::_M_dispose();
                    dVar3 = *(double *)
                             ((long)&((pvVar52->
                                      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::Sample>_>
                                      )._M_impl.super__Vector_impl_data._M_start)->t + lVar71);
                    linb::any::construct<tinyusdz::Token_const&>((any *)&toks,(Token *)&pvar);
                    tinyusdz::value::TimeSamples::add_sample(&ts_1,dVar3,(Value *)&toks);
                    if (CONCAT71(toks.
                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                 toks.
                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) != 0) {
                      (**(code **)(CONCAT71(toks.
                                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_
                                            ,toks.
                                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                             _0_1_) + 0x20))((string *)&toks);
                    }
                    ::std::__cxx11::string::_M_dispose();
                    lVar71 = lVar71 + 0x10;
                    uVar65 = extraout_RDX_13;
                  }
                  tinyusdz::value::TimeSamples::operator=(local_5f0,&ts_1);
                  ::std::
                  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ::~vector(&ts_1._samples);
                  v_02 = extraout_EDX_02;
                }
                if (((Animatable<tinyusdz::GeomMesh::InterpolateBoundary> *)local_940)->_has_value
                    == true) {
                  if (((Animatable<tinyusdz::GeomMesh::InterpolateBoundary> *)local_940)->_blocked
                      != false) {
                    ::std::__cxx11::string::append((char *)&err_1);
                    primvar::PrimVar::~PrimVar((PrimVar *)&ss_e);
                    Attribute::~Attribute((Attribute *)&ret);
                    ::std::__cxx11::string::string
                              ((string *)&pvar,"Convert Property {} failed: {}\n",(allocator *)&toks
                              );
                    fmt::format<char[31],std::__cxx11::string>
                              ((string *)&ret,(fmt *)&pvar,
                               (string *)"faceVaryingLinearInterpolation",(char (*) [31])&err_1,
                               in_R8);
                    goto LAB_0028a00c;
                  }
                  tinyusdz::to_string_abi_cxx11_
                            ((string *)&toks,
                             (tinyusdz *)
                             (ulong)((Animatable<tinyusdz::GeomMesh::InterpolateBoundary> *)
                                    local_940)->_value,v_02);
                  Token::Token((Token *)&pvar,(string *)&toks);
                  ::std::__cxx11::string::_M_dispose();
                  linb::any::construct<tinyusdz::Token_const&>((any *)&toks,(Token *)&pvar);
                  linb::any::operator=((any *)&ss_e,(any *)&toks);
                  if (CONCAT71(toks.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                               toks.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) != 0) {
                    (**(code **)(CONCAT71(toks.
                                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                          toks.
                                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_)
                                + 0x20))(&toks);
                  }
                  ::std::__cxx11::string::_M_dispose();
                }
                bVar18 = Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::
                         has_timesamples((Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>
                                          *)local_940);
                goto LAB_0028a4c7;
              }
              Attribute::Attribute((Attribute *)&ret);
              ret.contained.
              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .m_has_value = true;
              ret.contained.
              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._33_3_ = 0;
              ::std::__cxx11::string::string((string *)&ss_e,"token",(allocator *)&pvar);
              ::std::__cxx11::string::_M_assign(local_890);
              ::std::__cxx11::string::_M_dispose();
              if ((pGVar28->subdivisionScheme)._blocked == true) {
                local_858 = true;
              }
              if ((pGVar28->subdivisionScheme)._paths.
                  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  (pGVar28->subdivisionScheme)._paths.
                  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                          (&local_830,&(pGVar28->subdivisionScheme)._paths);
              }
              pSVar50 = TypedAttributeWithFallback<tinyusdz::GeomMesh::SubdivisionScheme>::get_value
                                  (&pGVar28->subdivisionScheme);
              pvar._value.v_.storage._8_8_ = 0;
              pvar._value.v_.vtable._0_1_ = 0;
              pvar._value.v_.vtable._1_7_ = 0;
              pvar._blocked = false;
              pvar._25_7_ = 0;
              pvar._ts._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
              local_600._M_allocated_capacity =
                   (size_type)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
              _ss_e = (char *)0x0;
              pvar._value.v_.storage._4_2_ = 1;
              pvar._value.v_.storage._0_4_ = *pSVar50;
              local_600._8_8_ = local_600._8_8_ & 0xffffffffffffff00;
              local_5f0[0]._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_5f0[0]._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
              local_5f0[0]._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
              local_5f0[0]._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
              local_5f0[0]._17_8_ = 0;
              tinyusdz::to_string_abi_cxx11_((string *)&ts_1,(tinyusdz *)(ulong)*pSVar50,v_00);
              Token::Token((Token *)&toks,(string *)&ts_1);
              ::std::__cxx11::string::_M_dispose();
              linb::any::construct<tinyusdz::Token_const&>((any *)&ts_1,(Token *)&toks);
              linb::any::operator=((any *)&ss_e,(any *)&ts_1);
              if (CONCAT71(ts_1._samples.
                           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                           ts_1._samples.
                           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) != 0) {
                (**(code **)(CONCAT71(ts_1._samples.
                                      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                      ts_1._samples.
                                      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) +
                            0x20))(&ts_1);
              }
              ::std::__cxx11::string::_M_dispose();
              Attribute::set_var((Attribute *)&ret,(PrimVar *)&ss_e);
              primvar::PrimVar::~PrimVar((PrimVar *)&ss_e);
              ::std::
              _Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::SubdivisionScheme>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::SubdivisionScheme>::Sample>_>
              ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::SubdivisionScheme>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::SubdivisionScheme>::Sample>_>
                               *)((long)&pvar._value.v_.storage + 8));
              AttrMetas::operator=(&local_818,&(pGVar28->subdivisionScheme)._metas);
              Property::Property((Property *)&ss_e,(Attribute *)&ret,false);
              Property::operator=(out_prop,(Property *)&ss_e);
              Property::~Property((Property *)&ss_e);
LAB_0028a545:
              Attribute::~Attribute((Attribute *)&ret);
              goto LAB_002879f2;
            }
            Attribute::Attribute((Attribute *)&ret);
            ret.contained.
            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .m_has_value = false;
            ret.contained.
            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._33_3_ = 0;
            ::std::__cxx11::string::string((string *)&ss_e,"token",(allocator *)&pvar);
            ::std::__cxx11::string::_M_assign(local_890);
            ::std::__cxx11::string::_M_dispose();
            if ((pGVar28->interpolateBoundary)._blocked == true) {
              local_858 = true;
            }
            local_8c0 = &(pGVar28->interpolateBoundary)._metas;
            if ((pGVar28->interpolateBoundary)._paths.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                (pGVar28->interpolateBoundary)._paths.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_start) {
              ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        (&local_830,&(pGVar28->interpolateBoundary)._paths);
            }
            local_940 = (AttrMetas *)
                        TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>_>
                        ::get_value((TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>_>
                                     *)local_8c0);
            local_600._M_allocated_capacity =
                 (size_type)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
            _ss_e = (char *)0x0;
            local_600._8_8_ = local_600._8_8_ & 0xffffffffffffff00;
            local_5f0[0]._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_5f0[0]._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
            local_5f0[0]._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
            local_5f0[0]._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
            local_5f0[0]._17_8_ = 0;
            bVar18 = Animatable<tinyusdz::GeomMesh::InterpolateBoundary>::has_timesamples
                               ((Animatable<tinyusdz::GeomMesh::InterpolateBoundary> *)local_940);
            v_01 = extraout_EDX;
            if (bVar18) {
              pvVar46 = TypedTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary>::get_samples
                                  (&((Animatable<tinyusdz::GeomMesh::InterpolateBoundary> *)
                                    local_940)->_ts);
              ts_1._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              ts_1._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
              ts_1._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
              ts_1._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
              ts_1._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
              ts_1._dirty = false;
              lVar71 = 0;
              uVar65 = extraout_RDX_10;
              for (uVar73 = 0;
                  pSVar10 = (pvVar46->
                            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary>::Sample>_>
                            )._M_impl.super__Vector_impl_data._M_start,
                  uVar73 < (ulong)((long)(pvVar46->
                                         super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary>::Sample>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar10
                                  >> 4); uVar73 = uVar73 + 1) {
                tinyusdz::to_string_abi_cxx11_
                          ((string *)&toks,
                           (tinyusdz *)(ulong)*(uint *)((long)&pSVar10->value + lVar71),
                           (InterpolateBoundary)uVar65);
                Token::Token((Token *)&pvar,(string *)&toks);
                ::std::__cxx11::string::_M_dispose();
                dVar3 = *(double *)
                         ((long)&((pvVar46->
                                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary>::Sample>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->t + lVar71);
                linb::any::construct<tinyusdz::Token_const&>((any *)&toks,(Token *)&pvar);
                tinyusdz::value::TimeSamples::add_sample(&ts_1,dVar3,(Value *)&toks);
                if (CONCAT71(toks.
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                             toks.
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) != 0) {
                  (**(code **)(CONCAT71(toks.
                                        super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                        toks.
                                        super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) +
                              0x20))((string *)&toks);
                }
                ::std::__cxx11::string::_M_dispose();
                lVar71 = lVar71 + 0x10;
                uVar65 = extraout_RDX_11;
              }
              tinyusdz::value::TimeSamples::operator=(local_5f0,&ts_1);
              ::std::
              vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ::~vector(&ts_1._samples);
              v_01 = extraout_EDX_00;
            }
            if (((Animatable<tinyusdz::GeomMesh::InterpolateBoundary> *)local_940)->_has_value !=
                true) {
LAB_0028a4ba:
              bVar18 = Animatable<tinyusdz::GeomMesh::InterpolateBoundary>::has_timesamples
                                 ((Animatable<tinyusdz::GeomMesh::InterpolateBoundary> *)local_940);
LAB_0028a4c7:
              if ((bVar18 != false) || (*(bool *)((long)local_940 + 4) == true)) {
                Attribute::set_var((Attribute *)&ret,(PrimVar *)&ss_e);
              }
              primvar::PrimVar::~PrimVar((PrimVar *)&ss_e);
              AttrMetas::operator=(&local_818,local_8c0);
              Property::Property((Property *)&ss_e,(Attribute *)&ret,false);
              Property::operator=(out_prop,(Property *)&ss_e);
              Property::~Property((Property *)&ss_e);
              goto LAB_0028a545;
            }
            if (((Animatable<tinyusdz::GeomMesh::InterpolateBoundary> *)local_940)->_blocked ==
                false) {
              tinyusdz::to_string_abi_cxx11_
                        ((string *)&toks,
                         (tinyusdz *)
                         (ulong)((Animatable<tinyusdz::GeomMesh::InterpolateBoundary> *)local_940)->
                                _value,v_01);
              Token::Token((Token *)&pvar,(string *)&toks);
              ::std::__cxx11::string::_M_dispose();
              linb::any::construct<tinyusdz::Token_const&>((any *)&toks,(Token *)&pvar);
              linb::any::operator=((any *)&ss_e,(any *)&toks);
              if (CONCAT71(toks.
                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                           toks.
                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) != 0) {
                (**(code **)(CONCAT71(toks.
                                      super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                      toks.
                                      super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) +
                            0x20))(&toks);
              }
              ::std::__cxx11::string::_M_dispose();
              goto LAB_0028a4ba;
            }
            ::std::__cxx11::string::append((char *)&err_1);
            primvar::PrimVar::~PrimVar((PrimVar *)&ss_e);
            Attribute::~Attribute((Attribute *)&ret);
            ::std::__cxx11::string::string
                      ((string *)&pvar,"Convert Property {} failed: {}\n",(allocator *)&toks);
            fmt::format<char[20],std::__cxx11::string>
                      ((string *)&ret,(fmt *)&pvar,(string *)"interpolateBoundary",
                       (char (*) [20])&err_1,in_R8);
LAB_0028a00c:
            _ss_e = (char *)&local_600;
            _Var2._M_p = (pointer)((long)&ret.contained.
                                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          .field_0 + 0x10);
            if (ret.contained.
                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .field_0.m_error._M_dataplus._M_p == (_Alloc_hider)_Var2._M_p) {
              local_600._8_8_ =
                   ret.contained.
                   super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .field_0._24_8_;
            }
            else {
              _ss_e = (char *)ret.contained.
                              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              .field_0.m_error._M_dataplus._M_p;
            }
            local_600._M_allocated_capacity._1_7_ =
                 ret.contained.
                 super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .field_0._17_7_;
            local_600._M_local_buf[0] =
                 ret.contained.
                 super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .field_0._16_1_;
            ret.contained.
            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .field_0.m_error._M_string_length = 0;
            ret.contained.
            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .field_0._16_1_ = 0;
            ret.contained.
            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .field_0.m_error._M_dataplus._M_p = (_Alloc_hider)_Var2._M_p;
            nonstd::expected_lite::
            expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&ret_1,(unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&ss_e);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
LAB_00287a02:
          ::std::__cxx11::string::_M_dispose();
        }
        if (ret_1.contained.
            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .m_has_value == true) {
          pvVar26 = nonstd::expected_lite::
                    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::value(&ret_1);
          if (*pvVar26 != false) goto LAB_002874c3;
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar27 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar27 = ::std::operator<<(poVar27,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                     );
          poVar27 = ::std::operator<<(poVar27,":");
          poVar27 = ::std::operator<<(poVar27,"GetProperty");
          poVar27 = ::std::operator<<(poVar27,"():");
          poVar27 = (ostream *)::std::ostream::operator<<(poVar27,0x792);
          ::std::operator<<(poVar27," ");
          ::std::__cxx11::string::string
                    ((string *)&pvar,"Attribute `{}` does not exist in Prim {}({})",
                     (allocator *)&ts_1);
          tinyusdz::value::TypeTraits<tinyusdz::GeomMesh>::type_name_abi_cxx11_();
          goto LAB_00287641;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar27 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar27 = ::std::operator<<(poVar27,
                                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                   );
        poVar27 = ::std::operator<<(poVar27,":");
        poVar27 = ::std::operator<<(poVar27,"GetProperty");
        poVar27 = ::std::operator<<(poVar27,"():");
        iVar68 = 0x792;
        goto LAB_00287533;
      }
      pvVar5 = (prim->_data).v_.vtable;
      if (pvVar5 == (vtable_type *)0x0) goto LAB_002893f3;
      uVar20 = (*pvVar5->type_id)();
      if (uVar20 != 0x40e) {
        pvVar5 = (prim->_data).v_.vtable;
        if (pvVar5 == (vtable_type *)0x0) goto LAB_002893f3;
        uVar20 = (*pvVar5->type_id)();
        if (uVar20 == 0x801) {
          pSVar32 = Prim::as<tinyusdz::Shader>(prim);
          if (out_prop == (Property *)0x0) {
            _ss_e = "[InternalError] nullptr in output Property is not allowed.";
            nonstd::expected_lite::
            expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::expected<const_char_*,_0>
                      ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&toks,(unexpected_type<const_char_*> *)&ss_e);
          }
          else {
            this_02 = &pSVar32->value;
            pUVar33 = tinyusdz::value::Value::as<tinyusdz::UsdPrimvarReader<float>>(this_02,false);
            if (pUVar33 == (UsdPrimvarReader<float> *)0x0) {
              pUVar40 = tinyusdz::value::Value::
                        as<tinyusdz::UsdPrimvarReader<std::array<float,2ul>>>(this_02,false);
              if (pUVar40 != (UsdPrimvarReader<std::array<float,_2UL>_> *)0x0) {
                _ss_e = (char *)&local_600;
                local_600._M_allocated_capacity =
                     local_600._M_allocated_capacity & 0xffffffffffffff00;
                bVar18 = ::std::operator==(attr_name,"inputs:varname");
                if (bVar18) {
                  pTVar67 = &pUVar40->varname;
                  psVar66 = extraout_RDX_04;
                  goto LAB_002882e3;
                }
                cVar23 = ::std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                         ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                 *)&(pUVar40->super_ShaderNode).super_UsdShadePrim.props,attr_name);
                if ((_Rb_tree_header *)cVar23._M_node ==
                    &(pUVar40->super_ShaderNode).super_UsdShadePrim.props._M_t._M_impl.
                     super__Rb_tree_header) {
                  uVar72 = 0;
                  goto LAB_002888a3;
                }
                Property::operator=(out_prop,(Property *)(cVar23._M_node + 2));
                goto LAB_002882ee;
              }
              pUVar42 = (UsdPrimvarReader<std::array<float,_4UL>_> *)
                        tinyusdz::value::Value::
                        as<tinyusdz::UsdPrimvarReader<std::array<float,3ul>>>(this_02,false);
              if (pUVar42 == (UsdPrimvarReader<std::array<float,_4UL>_> *)0x0) {
                pUVar42 = tinyusdz::value::Value::
                          as<tinyusdz::UsdPrimvarReader<std::array<float,4ul>>>(this_02,false);
                if (pUVar42 != (UsdPrimvarReader<std::array<float,_4UL>_> *)0x0) {
                  _ss_e = (char *)&local_600;
                  local_600._M_allocated_capacity =
                       local_600._M_allocated_capacity & 0xffffffffffffff00;
                  bVar18 = ::std::operator==(attr_name,"inputs:varname");
                  if (!bVar18) goto LAB_00288d3b;
                  pTVar67 = &pUVar42->varname;
                  psVar66 = extraout_RDX_08;
                  goto LAB_00288d2e;
                }
                pUVar44 = tinyusdz::value::Value::as<tinyusdz::UsdTransform2d>(this_02,false);
                if (pUVar44 == (UsdTransform2d *)0x0) {
                  pUVar47 = tinyusdz::value::Value::as<tinyusdz::UsdUVTexture>(this_02,false);
                  if (pUVar47 == (UsdUVTexture *)0x0) {
                    pUVar51 = tinyusdz::value::Value::as<tinyusdz::UsdPreviewSurface>(this_02,false)
                    ;
                    if (pUVar51 == (UsdPreviewSurface *)0x0) {
                      linb::any::type_name_abi_cxx11_((string *)&pvar,&this_02->v_);
                      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&ret,"TODO: ",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&pvar);
                      _ss_e = (char *)&local_600;
                      _Var2._M_p = (pointer)((long)&ret.contained.
                                                                                                        
                                                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  .field_0 + 0x10);
                      if (ret.contained.
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .field_0.m_error._M_dataplus._M_p == (_Alloc_hider)_Var2._M_p) {
                        local_600._8_8_ =
                             ret.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .field_0._24_8_;
                      }
                      else {
                        _ss_e = (char *)ret.contained.
                                        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        .field_0.m_error._M_dataplus._M_p;
                      }
                      local_600._M_allocated_capacity._1_7_ =
                           ret.contained.
                           super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .field_0._17_7_;
                      local_600._M_local_buf[0] =
                           ret.contained.
                           super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .field_0._16_1_;
                      ret.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .field_0.m_error._M_string_length = 0;
                      ret.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .field_0._16_1_ = 0;
                      ret.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .field_0.m_error._M_dataplus._M_p = (_Alloc_hider)_Var2._M_p;
                      nonstd::expected_lite::
                      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::
                      expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&toks,(unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)&ss_e);
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                      goto LAB_00288d80;
                    }
                    ts_1._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)&ts_1._samples.
                                   super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    ts_1._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                    ts_1._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                    ts_1._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                    bVar18 = ::std::operator==(attr_name,"diffuseColor");
                    if (bVar18) {
                      bVar18 = anon_unknown_6::ToProperty<tinyusdz::value::color3f>
                                         (&pUVar51->diffuseColor,out_prop,(string *)&ts_1);
                      if (!bVar18) {
                        ::std::__cxx11::string::string
                                  ((string *)&pvar,"Convert Property {} failed: {}\n",
                                   (allocator *)&ret_1);
                        pcVar64 = "inputs:diffuseColor";
LAB_00289f41:
                        fmt::format<char[13],std::__cxx11::string>
                                  ((string *)&ret,(fmt *)&pvar,(string *)(pcVar64 + 7),
                                   (char (*) [13])&ts_1,in_R8);
                        goto LAB_0028adef;
                      }
                    }
                    else {
                      bVar18 = ::std::operator==(attr_name,"emissiveColor");
                      if (bVar18) {
                        bVar18 = anon_unknown_6::ToProperty<tinyusdz::value::color3f>
                                           (&pUVar51->emissiveColor,out_prop,(string *)&ts_1);
                        if (!bVar18) {
                          ::std::__cxx11::string::string
                                    ((string *)&pvar,"Convert Property {} failed: {}\n",
                                     (allocator *)&ret_1);
                          pcVar64 = "inputs:emissiveColor";
LAB_0028adc5:
                          fmt::format<char[14],std::__cxx11::string>
                                    ((string *)&ret,(fmt *)&pvar,(string *)(pcVar64 + 7),
                                     (char (*) [14])&ts_1,in_R8);
LAB_0028adef:
                          _ss_e = (char *)&local_600;
                          _Var2._M_p = (pointer)((long)&ret.contained.
                                                                                                                
                                                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  .field_0 + 0x10);
                          uVar65 = (pointer)ret.contained.
                                            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            .field_0.m_error._M_dataplus._M_p;
                          if (ret.contained.
                              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              .field_0.m_error._M_dataplus._M_p == (_Alloc_hider)_Var2._M_p) {
                            local_600._8_8_ =
                                 ret.contained.
                                 super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 .field_0._24_8_;
                            uVar65 = _ss_e;
                          }
                          _ss_e = (char *)uVar65;
                          local_600._M_allocated_capacity._1_7_ =
                               ret.contained.
                               super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               .field_0._17_7_;
                          local_600._M_local_buf[0] =
                               ret.contained.
                               super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               .field_0._16_1_;
                          ret.contained.
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .field_0.m_error._M_string_length = 0;
                          ret.contained.
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .field_0._16_1_ = 0;
                          ret.contained.
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .field_0.m_error._M_dataplus._M_p = (_Alloc_hider)_Var2._M_p;
                          nonstd::expected_lite::
                          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::
                          expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&toks,(unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               *)&ss_e);
                          ::std::__cxx11::string::_M_dispose();
                          ::std::__cxx11::string::_M_dispose();
                          ::std::__cxx11::string::_M_dispose();
                          goto LAB_00288d80;
                        }
                      }
                      else {
                        bVar18 = ::std::operator==(attr_name,"specularColor");
                        if (bVar18) {
                          bVar18 = anon_unknown_6::ToProperty<tinyusdz::value::color3f>
                                             (&pUVar51->specularColor,out_prop,(string *)&ts_1);
                          if (!bVar18) {
                            ::std::__cxx11::string::string
                                      ((string *)&pvar,"Convert Property {} failed: {}\n",
                                       (allocator *)&ret_1);
                            pcVar64 = "inputs:specularColor";
                            goto LAB_0028adc5;
                          }
                        }
                        else {
                          bVar18 = ::std::operator==(attr_name,"useSpecularWorkflow");
                          if (bVar18) {
                            Attribute::Attribute((Attribute *)&ret);
                            ret.contained.
                            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            .m_has_value = false;
                            ret.contained.
                            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._33_3_ = 0;
                            tinyusdz::value::TypeTraits<int>::type_name_abi_cxx11_();
                            ::std::__cxx11::string::_M_assign(local_890);
                            ::std::__cxx11::string::_M_dispose();
                            if ((pUVar51->useSpecularWorkflow)._blocked == true) {
                              local_858 = true;
                            }
                            local_9f0 = &(pUVar51->useSpecularWorkflow)._metas;
                            if ((pUVar51->useSpecularWorkflow)._paths.
                                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                                _M_impl.super__Vector_impl_data._M_finish !=
                                (pUVar51->useSpecularWorkflow)._paths.
                                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                                _M_impl.super__Vector_impl_data._M_start) {
                              ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::
                              operator=(&local_830,&(pUVar51->useSpecularWorkflow)._paths);
                            }
                            pAVar56 = TypedAttributeWithFallback<tinyusdz::Animatable<int>_>::
                                      get_value((TypedAttributeWithFallback<tinyusdz::Animatable<int>_>
                                                 *)local_9f0);
                            Animatable<int>::Animatable((Animatable<int> *)&pvar,pAVar56);
                            local_600._M_allocated_capacity =
                                 (size_type)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
                            _ss_e = (char *)0x0;
                            local_600._8_8_ = local_600._8_8_ & 0xffffffffffffff00;
                            local_5f0[0]._samples.
                            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                            local_5f0[0]._samples.
                            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                            ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                            local_5f0[0]._samples.
                            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                            ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                            local_5f0[0]._samples.
                            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                            local_5f0[0]._17_8_ = 0;
                            bVar18 = Animatable<int>::has_timesamples((Animatable<int> *)&pvar);
                            if (bVar18) {
                              pvVar57 = TypedTimeSamples<int>::get_samples
                                                  ((TypedTimeSamples<int> *)
                                                   ((long)&pvar._value.v_.storage + 8));
                              ret_1.contained.
                              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              .field_0.m_error._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
                              ret_1.contained.
                              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              .field_0.m_error._M_string_length._0_4_ = 0;
                              ret_1.contained.
                              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              .field_0.m_error._M_string_length._4_4_ = 0;
                              ret_1.contained.
                              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              .field_0._16_1_ = 0;
                              ret_1.contained.
                              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              .field_0._17_7_ = 0;
                              ret_1.contained.
                              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              .field_0._24_1_ = 0;
                              lVar71 = 8;
                              for (uVar73 = 0;
                                  pSVar14 = (pvVar57->
                                            super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                                            )._M_impl.super__Vector_impl_data._M_start,
                                  uVar73 < (ulong)((long)(pvVar57->
                                                                                                                  
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)pSVar14 >> 4); uVar73 = uVar73 + 1) {
                                err_1.field_2._M_allocated_capacity =
                                     (size_type)linb::any::vtable_for_type<int>()::table;
                                err_1._M_dataplus._M_p._0_4_ =
                                     *(undefined4 *)((long)&pSVar14->t + lVar71);
                                tinyusdz::value::TimeSamples::add_sample
                                          ((TimeSamples *)&ret_1,
                                           *(double *)((long)pSVar14 + lVar71 + -8),(Value *)&err_1)
                                ;
                                if (err_1.field_2._M_allocated_capacity != 0) {
                                  (**(code **)(err_1.field_2._M_allocated_capacity + 0x20))(&err_1);
                                }
                                lVar71 = lVar71 + 0x10;
                              }
                              tinyusdz::value::TimeSamples::operator=
                                        (local_5f0,(TimeSamples *)&ret_1);
                              ::std::
                              vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                              ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                         *)&ret_1);
                            }
                            if (pvar._value.v_.storage._4_1_ == '\x01') {
                              if (pvar._value.v_.storage._5_1_ != '\0') {
                                ::std::__cxx11::string::append((char *)&ts_1);
                                primvar::PrimVar::~PrimVar((PrimVar *)&ss_e);
                                ::std::
                                _Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                                ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                                                 *)((long)&pvar._value.v_.storage + 8));
                                Attribute::~Attribute((Attribute *)&ret);
                                ::std::__cxx11::string::string
                                          ((string *)&pvar,"Convert Property {} failed: {}\n",
                                           (allocator *)&ret_1);
                                fmt::format<char[20],std::__cxx11::string>
                                          ((string *)&ret,(fmt *)&pvar,(string *)0x333525,
                                           (char (*) [20])&ts_1,in_R8);
                                goto LAB_0028adef;
                              }
                              ret_1.contained.
                              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              .field_0._16_1_ = 0x68;
                              ret_1.contained.
                              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              .field_0._17_7_ = 0x3f0f;
                              ret_1.contained.
                              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              .field_0._0_4_ = pvar._value.v_.storage._0_4_;
                              linb::any::operator=((any *)&ss_e,(any *)&ret_1);
                              if (CONCAT71(ret_1.contained.
                                           super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           .field_0._17_7_,
                                           ret_1.contained.
                                           super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           .field_0._16_1_) != 0) {
                                (**(code **)(CONCAT71(ret_1.contained.
                                                                                                            
                                                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  .field_0._17_7_,
                                                  ret_1.contained.
                                                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  .field_0._16_1_) + 0x20))(&ret_1);
                              }
                            }
                            Attribute::set_var((Attribute *)&ret,(PrimVar *)&ss_e);
                            primvar::PrimVar::~PrimVar((PrimVar *)&ss_e);
                            ::std::
                            _Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                            ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                                             *)((long)&pvar._value.v_.storage + 8));
LAB_0028bcc2:
                            AttrMetas::operator=(&local_818,local_9f0);
                            Property::Property((Property *)&ss_e,(Attribute *)&ret,false);
                            Property::operator=(out_prop,(Property *)&ss_e);
                            Property::~Property((Property *)&ss_e);
                            Attribute::~Attribute((Attribute *)&ret);
                          }
                          else {
                            bVar18 = ::std::operator==(attr_name,"metallic");
                            if (bVar18) {
                              bVar18 = anon_unknown_6::ToProperty<float>
                                                 (&pUVar51->metallic,out_prop,(string *)&ts_1);
                              if (!bVar18) {
                                ::std::__cxx11::string::string
                                          ((string *)&pvar,"Convert Property {} failed: {}\n",
                                           (allocator *)&ret_1);
                                fmt::format<char[9],std::__cxx11::string>
                                          ((string *)&ret,(fmt *)&pvar,(string *)0x333486,
                                           (char (*) [9])&ts_1,in_R8);
                                goto LAB_0028adef;
                              }
                            }
                            else {
                              bVar18 = ::std::operator==(attr_name,"clearcoat");
                              if (bVar18) {
                                bVar18 = anon_unknown_6::ToProperty<float>
                                                   (&pUVar51->clearcoat,out_prop,(string *)&ts_1);
                                if (!bVar18) {
                                  ::std::__cxx11::string::string
                                            ((string *)&pvar,"Convert Property {} failed: {}\n",
                                             (allocator *)&ret_1);
                                  psVar66 = (string *)0x333496;
LAB_0028be6b:
                                  fmt::format<char[10],std::__cxx11::string>
                                            ((string *)&ret,(fmt *)&pvar,psVar66,
                                             (char (*) [10])&ts_1,in_R8);
                                  goto LAB_0028adef;
                                }
                              }
                              else {
                                bVar18 = ::std::operator==(attr_name,"clearcoatRoughness");
                                if (bVar18) {
                                  bVar18 = anon_unknown_6::ToProperty<float>
                                                     (&pUVar51->clearcoatRoughness,out_prop,
                                                      (string *)&ts_1);
                                  if (!bVar18) {
                                    ::std::__cxx11::string::string
                                              ((string *)&pvar,"Convert Property {} failed: {}\n",
                                               (allocator *)&ret_1);
                                    fmt::format<char[19],std::__cxx11::string>
                                              ((string *)&ret,(fmt *)&pvar,(string *)0x3334a7,
                                               (char (*) [19])&ts_1,in_R8);
                                    goto LAB_0028adef;
                                  }
                                }
                                else {
                                  bVar18 = ::std::operator==(attr_name,"roughness");
                                  if (bVar18) {
                                    bVar18 = anon_unknown_6::ToProperty<float>
                                                       (&pUVar51->roughness,out_prop,(string *)&ts_1
                                                       );
                                    if (!bVar18) {
                                      ::std::__cxx11::string::string
                                                ((string *)&pvar,"Convert Property {} failed: {}\n",
                                                 (allocator *)&ret_1);
                                      psVar66 = (string *)0x333460;
                                      goto LAB_0028be6b;
                                    }
                                  }
                                  else {
                                    bVar18 = ::std::operator==(attr_name,"opacity");
                                    if (bVar18) {
                                      bVar18 = anon_unknown_6::ToProperty<float>
                                                         (&pUVar51->opacity,out_prop,(string *)&ts_1
                                                         );
                                      if (!bVar18) {
                                        ::std::__cxx11::string::string
                                                  ((string *)&pvar,
                                                   "Convert Property {} failed: {}\n",
                                                   (allocator *)&ret_1);
                                        fmt::format<char[8],std::__cxx11::string>
                                                  ((string *)&ret,(fmt *)&pvar,(string *)0x3334c1,
                                                   (char (*) [8])&ts_1,in_R8);
                                        goto LAB_0028adef;
                                      }
                                    }
                                    else {
                                      bVar18 = ::std::operator==(attr_name,"opacityThreshold");
                                      if (bVar18) {
                                        bVar18 = anon_unknown_6::ToProperty<float>
                                                           (&pUVar51->opacityThreshold,out_prop,
                                                            (string *)&ts_1);
                                        if (!bVar18) {
                                          ::std::__cxx11::string::string
                                                    ((string *)&pvar,
                                                     "Convert Property {} failed: {}\n",
                                                     (allocator *)&ret_1);
                                          fmt::format<char[17],std::__cxx11::string>
                                                    ((string *)&ret,(fmt *)&pvar,(string *)0x3334d0,
                                                     (char (*) [17])&ts_1,in_R8);
                                          goto LAB_0028adef;
                                        }
                                      }
                                      else {
                                        bVar18 = ::std::operator==(attr_name,"ior");
                                        if (bVar18) {
                                          bVar18 = anon_unknown_6::ToProperty<float>
                                                             (&pUVar51->ior,out_prop,(string *)&ts_1
                                                             );
                                          if (!bVar18) {
                                            ::std::__cxx11::string::string
                                                      ((string *)&pvar,
                                                       "Convert Property {} failed: {}\n",
                                                       (allocator *)&ret_1);
                                            fmt::format<char[4],std::__cxx11::string>
                                                      ((string *)&ret,(fmt *)&pvar,
                                                       (string *)0x3334e8,(char (*) [4])&ts_1,in_R8)
                                            ;
                                            goto LAB_0028adef;
                                          }
                                        }
                                        else {
                                          bVar18 = ::std::operator==(attr_name,"normal");
                                          if (bVar18) {
                                            Attribute::Attribute((Attribute *)&ret);
                                            ret.contained.
                                            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            .m_has_value = false;
                                            ret.contained.
                                            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            ._33_3_ = 0;
                                            tinyusdz::value::TypeTraits<tinyusdz::value::normal3f>::
                                            type_name_abi_cxx11_();
                                            ::std::__cxx11::string::_M_assign(local_890);
                                            ::std::__cxx11::string::_M_dispose();
                                            if ((pUVar51->normal)._blocked == true) {
                                              local_858 = true;
                                            }
                                            local_9f0 = &(pUVar51->normal)._metas;
                                            if ((pUVar51->normal)._paths.
                                                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                                ._M_impl.super__Vector_impl_data._M_finish !=
                                                (pUVar51->normal)._paths.
                                                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                                ._M_impl.super__Vector_impl_data._M_start) {
                                              ::std::
                                              vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                              ::operator=(&local_830,&(pUVar51->normal)._paths);
                                            }
                                            pAVar62 = 
                                                  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::normal3f>_>
                                                  ::get_value((
                                                  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::normal3f>_>
                                                  *)local_9f0);
                                            Animatable<tinyusdz::value::normal3f>::Animatable
                                                      ((Animatable<tinyusdz::value::normal3f> *)
                                                       &pvar,pAVar62);
                                            local_600._M_allocated_capacity =
                                                 (size_type)
                                                 &linb::any::vtable_for_type<decltype(nullptr)>()::
                                                  table;
                                            _ss_e = (char *)0x0;
                                            local_600._8_8_ = local_600._8_8_ & 0xffffffffffffff00;
                                            local_5f0[0]._samples.
                                            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0
                                            ;
                                            local_5f0[0]._samples.
                                            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                            ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                                            local_5f0[0]._samples.
                                            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                            ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                                            local_5f0[0]._samples.
                                            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_
                                                 = 0;
                                            local_5f0[0]._17_8_ = 0;
                                            bVar18 = Animatable<tinyusdz::value::normal3f>::
                                                     has_timesamples((
                                                  Animatable<tinyusdz::value::normal3f> *)&pvar);
                                            if (bVar18) {
                                              pvVar63 = TypedTimeSamples<tinyusdz::value::normal3f>
                                                        ::get_samples((
                                                  TypedTimeSamples<tinyusdz::value::normal3f> *)
                                                  &pvar._value.v_.vtable);
                                              ret_1.contained.
                                              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              .field_0.m_error._M_dataplus._M_p =
                                                   (_Alloc_hider)(pointer)0x0;
                                              ret_1.contained.
                                              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              .field_0.m_error._M_string_length._0_4_ = 0;
                                              ret_1.contained.
                                              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              .field_0.m_error._M_string_length._4_4_ = 0;
                                              ret_1.contained.
                                              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              .field_0._16_1_ = 0;
                                              ret_1.contained.
                                              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              .field_0._17_7_ = 0;
                                              ret_1.contained.
                                              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              .field_0._24_1_ = 0;
                                              lVar71 = 8;
                                              for (uVar73 = 0;
                                                  pSVar17 = (pvVar63->
                                                                                                                        
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  )._M_impl.super__Vector_impl_data._M_start,
                                                  uVar73 < (ulong)(((long)(pvVar63->
                                                                                                                                                    
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)pSVar17) / 0x18); uVar73 = uVar73 + 1) {
                                                err_1.field_2._M_allocated_capacity =
                                                     (size_type)
                                                     linb::any::
                                                     vtable_for_type<tinyusdz::value::normal3f>()::
                                                     table;
                                                err_1._M_dataplus._M_p =
                                                     *(pointer *)((long)&pSVar17->t + lVar71);
                                                err_1._M_string_length =
                                                     CONCAT44(err_1._M_string_length._4_4_,
                                                              *(undefined4 *)
                                                               ((long)&(pSVar17->value).x + lVar71))
                                                ;
                                                tinyusdz::value::TimeSamples::add_sample
                                                          ((TimeSamples *)&ret_1,
                                                           *(double *)((long)pSVar17 + lVar71 + -8),
                                                           (Value *)&err_1);
                                                if (err_1.field_2._M_allocated_capacity != 0) {
                                                  (**(code **)(err_1.field_2._M_allocated_capacity +
                                                              0x20))(&err_1);
                                                }
                                                lVar71 = lVar71 + 0x18;
                                              }
                                              tinyusdz::value::TimeSamples::operator=
                                                        (local_5f0,(TimeSamples *)&ret_1);
                                              ::std::
                                              vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                              ::~vector((
                                                  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                                  *)&ret_1);
                                            }
                                            if (pvar._value.v_.storage._12_1_ == '\x01') {
                                              if (pvar._value.v_.storage._13_1_ != '\0') {
                                                ::std::__cxx11::string::append((char *)&ts_1);
                                                primvar::PrimVar::~PrimVar((PrimVar *)&ss_e);
                                                ::std::
                                                _Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                ::~_Vector_base((
                                                  _Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  *)&pvar._value.v_.vtable);
                                                Attribute::~Attribute((Attribute *)&ret);
                                                ::std::__cxx11::string::string
                                                          ((string *)&pvar,
                                                           "Convert Property {} failed: {}\n",
                                                           (allocator *)&ret_1);
                                                fmt::format<char[7],std::__cxx11::string>
                                                          ((string *)&ret,(fmt *)&pvar,
                                                           (string *)0x3334f3,(char (*) [7])&ts_1,
                                                           in_R8);
                                                goto LAB_0028adef;
                                              }
                                              ret_1.contained.
                                              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              .field_0.m_error._M_string_length._0_4_ =
                                                   pvar._value.v_.storage._8_4_;
                                              ret_1.contained.
                                              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              .field_0.m_error._M_dataplus._M_p =
                                                   (_Alloc_hider)
                                                   (_Alloc_hider)pvar._value.v_.storage.dynamic;
                                              ret_1.contained.
                                              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              .field_0._16_1_ = 0xe8;
                                              ret_1.contained.
                                              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              .field_0._17_7_ = 0x3f20;
                                              linb::any::operator=((any *)&ss_e,(any *)&ret_1);
                                              if (CONCAT71(ret_1.contained.
                                                                                                                      
                                                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  .field_0._17_7_,
                                                  ret_1.contained.
                                                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  .field_0._16_1_) != 0) {
                                                (**(code **)(CONCAT71(ret_1.contained.
                                                                                                                                            
                                                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  .field_0._17_7_,
                                                  ret_1.contained.
                                                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  .field_0._16_1_) + 0x20))(&ret_1);
                                              }
                                            }
                                            Attribute::set_var((Attribute *)&ret,(PrimVar *)&ss_e);
                                            primvar::PrimVar::~PrimVar((PrimVar *)&ss_e);
                                            ::std::
                                            _Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                            ::~_Vector_base((
                                                  _Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                                  *)&pvar._value.v_.vtable);
                                            goto LAB_0028bcc2;
                                          }
                                          bVar18 = ::std::operator==(attr_name,"displacement");
                                          if (bVar18) {
                                            bVar18 = anon_unknown_6::ToProperty<float>
                                                               (&pUVar51->displacement,out_prop,
                                                                (string *)&ts_1);
                                            if (!bVar18) {
                                              ::std::__cxx11::string::string
                                                        ((string *)&pvar,
                                                         "Convert Property {} failed: {}\n",
                                                         (allocator *)&ret_1);
                                              pcVar64 = "inputs:displacement";
                                              goto LAB_00289f41;
                                            }
                                          }
                                          else {
                                            bVar18 = ::std::operator==(attr_name,"occlusion");
                                            if (!bVar18) {
                                              bVar18 = ::std::operator==(attr_name,"outputs:surface"
                                                                        );
                                              if (bVar18) {
                                                cVar4 = (pUVar51->outputsSurface)._authored;
joined_r0x0028c683:
                                                if (cVar4 == '\x01') {
                                                  ::std::__cxx11::string::string
                                                            ((string *)&ret,"token",
                                                             (allocator *)&pvar);
                                                  Property::MakeEmptyAttrib
                                                            ((Property *)&ss_e,(string *)&ret,false)
                                                  ;
                                                  Property::operator=(out_prop,(Property *)&ss_e);
                                                  Property::~Property((Property *)&ss_e);
                                                  ::std::__cxx11::string::_M_dispose();
                                                  goto LAB_0028bd04;
                                                }
                                              }
                                              else {
                                                bVar18 = ::std::operator==(attr_name,
                                                                           "outputs:displacement");
                                                if (bVar18) {
                                                  cVar4 = (pUVar51->outputsDisplacement)._authored;
                                                  goto joined_r0x0028c683;
                                                }
                                                cVar23 = ::std::
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                                  ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                                  *)&(pUVar51->super_ShaderNode).super_UsdShadePrim.
                                                     props,attr_name);
                                                if ((_Rb_tree_header *)cVar23._M_node !=
                                                    &(pUVar51->super_ShaderNode).super_UsdShadePrim.
                                                     props._M_t._M_impl.super__Rb_tree_header) {
                                                  Property::operator=(out_prop,(Property *)
                                                                               (cVar23._M_node + 2))
                                                  ;
                                                  goto LAB_0028bd04;
                                                }
                                              }
                                              local_978 = true;
                                              toks.
                                              super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                              ._M_impl.super__Vector_impl_data._M_start =
                                                   (pointer)((ulong)toks.
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start &
                                                  0xffffffffffffff00);
                                              goto LAB_00288d80;
                                            }
                                            bVar18 = anon_unknown_6::ToProperty<float>
                                                               (&pUVar51->occlusion,out_prop,
                                                                (string *)&ts_1);
                                            if (!bVar18) {
                                              ::std::__cxx11::string::string
                                                        ((string *)&pvar,
                                                         "Convert Property {} failed: {}\n",
                                                         (allocator *)&ret_1);
                                              psVar66 = (string *)0x333514;
                                              goto LAB_0028be6b;
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
LAB_0028bd04:
                    local_978 = true;
                    toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                    _M_impl.super__Vector_impl_data._M_start =
                         (pointer)CONCAT71(toks.
                                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                           ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
                  }
                  else {
                    ts_1._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)&ts_1._samples.
                                   super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    ts_1._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                    ts_1._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                    ts_1._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                    bVar18 = ::std::operator==(attr_name,"inputs:file");
                    if (bVar18) {
                      Attribute::Attribute((Attribute *)&ret);
                      ret.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value = false;
                      ret.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._33_3_ = 0;
                      tinyusdz::value::TypeTraits<tinyusdz::value::AssetPath>::type_name_abi_cxx11_
                                ();
                      ::std::__cxx11::string::_M_assign(local_890);
                      ::std::__cxx11::string::_M_dispose();
                      if ((pUVar47->file)._blocked == true) {
                        local_858 = true;
                      }
                      if ((pUVar47->file)._paths.
                          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                          _M_impl.super__Vector_impl_data._M_finish !=
                          (pUVar47->file)._paths.
                          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                          _M_impl.super__Vector_impl_data._M_start) {
                        ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                                  (&local_830,&(pUVar47->file)._paths);
                      }
                      pvar._value.v_.vtable._0_1_ = 0x60;
                      pvar._value.v_.vtable._1_7_ = 0x3f04;
                      pvar._value.v_.storage.dynamic = (void *)0x0;
                      pvar._blocked = false;
                      pvar._ts._samples.
                      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
                      pvar._ts._samples.
                      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_start._1_7_ = 0;
                      pvar._ts._samples.
                      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                      pvar._ts._samples.
                      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                      pvar._ts._samples.
                      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                      pvar._ts._17_8_ = 0;
                      nonstd::optional_lite::
                      optional<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>::optional
                                ((optional<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *)
                                 &ss_e,&(pUVar47->file)._attrib);
                      if (ss_e == (ostringstream)0x1) {
                        pvVar48 = nonstd::optional_lite::
                                  optional<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>::value
                                            ((optional<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>
                                              *)&ss_e);
                        if (pvVar48->_blocked == true) {
                          local_858 = true;
                        }
                        pvVar48 = nonstd::optional_lite::
                                  optional<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>::value
                                            ((optional<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>
                                              *)&ss_e);
                        if (pvVar48->_has_value == true) {
                          ret_1.contained.
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .field_0.m_error._M_dataplus._M_p =
                               (_Alloc_hider)
                               ((long)&ret_1.contained.
                                       super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       .field_0 + 0x10);
                          ret_1.contained.
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .field_0.m_error._M_string_length._0_4_ = 0;
                          ret_1.contained.
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .field_0.m_error._M_string_length._4_4_ = 0;
                          ret_1.contained.
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .field_0._16_1_ = 0;
                          ret_1.contained.
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._32_8_ = &local_8f8;
                          local_8f8._M_local_buf[0] = '\0';
                          pvVar48 = nonstd::optional_lite::
                                    optional<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>::
                                    value((optional<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>
                                           *)&ss_e);
                          bVar18 = Animatable<tinyusdz::value::AssetPath>::get_scalar
                                             (pvVar48,(AssetPath *)&ret_1);
                          if (bVar18) {
                            linb::any::construct<tinyusdz::value::AssetPath_const&>
                                      ((any *)&err_1,(AssetPath *)&ret_1);
                            linb::any::operator=((any *)&pvar,(any *)&err_1);
                            if (err_1.field_2._M_allocated_capacity != 0) {
                              (**(code **)(err_1.field_2._M_allocated_capacity + 0x20))(&err_1);
                            }
                          }
                          tinyusdz::value::AssetPath::~AssetPath((AssetPath *)&ret_1);
                        }
                        pvVar48 = nonstd::optional_lite::
                                  optional<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>::value
                                            ((optional<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>
                                              *)&ss_e);
                        bVar18 = Animatable<tinyusdz::value::AssetPath>::has_timesamples(pvVar48);
                        if (bVar18) {
                          pvVar48 = nonstd::optional_lite::
                                    optional<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>::
                                    value((optional<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>
                                           *)&ss_e);
                          pvVar49 = TypedTimeSamples<tinyusdz::value::AssetPath>::get_samples
                                              (&pvVar48->_ts);
                          ret_1.contained.
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .field_0.m_error._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
                          ret_1.contained.
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .field_0.m_error._M_string_length._0_4_ = 0;
                          ret_1.contained.
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .field_0.m_error._M_string_length._4_4_ = 0;
                          ret_1.contained.
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .field_0._16_1_ = 0;
                          ret_1.contained.
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .field_0._17_7_ = 0;
                          ret_1.contained.
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .field_0._24_1_ = 0;
                          lVar71 = 8;
                          for (uVar73 = 0;
                              pSVar11 = (pvVar49->
                                        super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample>_>
                                        )._M_impl.super__Vector_impl_data._M_start,
                              uVar73 < (ulong)(((long)(pvVar49->
                                                                                                            
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                               (long)pSVar11) / 0x50); uVar73 = uVar73 + 1) {
                            dVar3 = *(double *)((long)pSVar11 + lVar71 + -8);
                            linb::any::construct<tinyusdz::value::AssetPath_const&>
                                      ((any *)&err_1,(AssetPath *)((long)&pSVar11->t + lVar71));
                            tinyusdz::value::TimeSamples::add_sample
                                      ((TimeSamples *)&ret_1,dVar3,(Value *)&err_1);
                            if (err_1.field_2._M_allocated_capacity != 0) {
                              (**(code **)(err_1.field_2._M_allocated_capacity + 0x20))(&err_1);
                            }
                            lVar71 = lVar71 + 0x50;
                          }
                          tinyusdz::value::TimeSamples::operator=(&pvar._ts,(TimeSamples *)&ret_1);
                          ::std::
                          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                          ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                     *)&ret_1);
                        }
                        pvVar48 = nonstd::optional_lite::
                                  optional<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>::value
                                            ((optional<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>
                                              *)&ss_e);
                        if (pvVar48->_has_value == false) {
                          pvVar48 = nonstd::optional_lite::
                                    optional<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>::
                                    value((optional<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>
                                           *)&ss_e);
                          bVar18 = Animatable<tinyusdz::value::AssetPath>::has_timesamples(pvVar48);
                          if (!bVar18) goto LAB_0028acc9;
                        }
                        Attribute::set_var((Attribute *)&ret,&pvar);
                      }
LAB_0028acc9:
                      nonstd::optional_lite::
                      optional<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>::~optional
                                ((optional<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *)
                                 &ss_e);
                      primvar::PrimVar::~PrimVar(&pvar);
                      AttrMetas::operator=(&local_818,&(pUVar47->file)._metas);
                      Property::Property((Property *)&ss_e,(Attribute *)&ret,false);
                      Property::operator=(out_prop,(Property *)&ss_e);
                      Property::~Property((Property *)&ss_e);
                      Attribute::~Attribute((Attribute *)&ret);
LAB_0028ad2a:
                      uVar72 = 1;
                    }
                    else {
                      cVar23 = ::std::
                               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                       *)&(pUVar47->super_ShaderNode).super_UsdShadePrim.props,
                                      attr_name);
                      if ((_Rb_tree_header *)cVar23._M_node !=
                          &(pUVar47->super_ShaderNode).super_UsdShadePrim.props._M_t._M_impl.
                           super__Rb_tree_header) {
                        Property::operator=(out_prop,(Property *)(cVar23._M_node + 2));
                        goto LAB_0028ad2a;
                      }
                      uVar72 = 0;
                    }
                    local_978 = true;
                    toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                    _M_impl.super__Vector_impl_data._M_start =
                         (pointer)CONCAT71(toks.
                                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                           ._M_impl.super__Vector_impl_data._M_start._1_7_,uVar72);
                  }
                }
                else {
                  ret.contained.
                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .field_0.m_error._M_dataplus._M_p =
                       (_Alloc_hider)
                       ((long)&ret.contained.
                               super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               .field_0 + 0x10);
                  ret.contained.
                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .field_0.m_error._M_string_length = 0;
                  ret.contained.
                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .field_0._16_1_ = 0;
                  bVar18 = ::std::operator==(attr_name,"rotation");
                  if (bVar18) {
                    bVar18 = anon_unknown_6::ToProperty<float>
                                       (&pUVar44->rotation,out_prop,(string *)&ret);
                    if (bVar18) goto LAB_0028b7d1;
                    ::std::__cxx11::string::string
                              ((string *)&ret_1,"Convert Property {} failed: {}\n",
                               (allocator *)&ts_1);
                    fmt::format<char[9],std::__cxx11::string>
                              ((string *)&pvar,(fmt *)&ret_1,(string *)0x3336ad,(char (*) [9])&ret,
                               in_R8);
                  }
                  else {
                    bVar18 = ::std::operator==(attr_name,"scale");
                    if (bVar18) {
                      bVar18 = (anonymous_namespace)::ToProperty<std::array<float,2ul>>
                                         (&pUVar44->scale,out_prop,(string *)&ret);
                      if (bVar18) goto LAB_0028b7d1;
                      ::std::__cxx11::string::string
                                ((string *)&ret_1,"Convert Property {} failed: {}\n",
                                 (allocator *)&ts_1);
                      fmt::format<char[6],std::__cxx11::string>
                                ((string *)&pvar,(fmt *)&ret_1,(string *)0x3327e8,(char (*) [6])&ret
                                 ,in_R8);
                    }
                    else {
                      bVar18 = ::std::operator==(attr_name,"translation");
                      if (!bVar18) {
                        bVar18 = ::std::operator==(attr_name,"outputs:result");
                        if (bVar18) {
                          if ((pUVar44->result)._authored == false) {
LAB_0028aabb:
                            local_978 = true;
                            toks.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_start =
                                 (pointer)((ulong)toks.
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start &
                                          0xffffffffffffff00);
                            goto LAB_00288d80;
                          }
                          if ((pUVar44->result)._actual_type_name._M_string_length == 0) {
                            tinyusdz::value::TypeTraits<std::array<float,2ul>>::type_name_abi_cxx11_
                                      ();
                          }
                          else {
                            ::std::__cxx11::string::string
                                      ((string *)&pvar,
                                       (string *)&(pUVar44->result)._actual_type_name);
                          }
                          Property::MakeEmptyAttrib((Property *)&ss_e,(string *)&pvar,false);
                          Property::operator=(out_prop,(Property *)&ss_e);
                          Property::~Property((Property *)&ss_e);
                          ::std::__cxx11::string::_M_dispose();
                        }
                        else {
                          cVar23 = ::std::
                                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                           *)&(pUVar44->super_ShaderNode).super_UsdShadePrim.props,
                                          attr_name);
                          if ((_Rb_tree_header *)cVar23._M_node ==
                              &(pUVar44->super_ShaderNode).super_UsdShadePrim.props._M_t._M_impl.
                               super__Rb_tree_header) goto LAB_0028aabb;
                          Property::operator=(out_prop,(Property *)(cVar23._M_node + 2));
                        }
LAB_0028b7d1:
                        local_978 = true;
                        toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_start =
                             (pointer)CONCAT71(toks.
                                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                               ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
                        goto LAB_00288d80;
                      }
                      bVar18 = (anonymous_namespace)::ToProperty<std::array<float,2ul>>
                                         (&pUVar44->translation,out_prop,(string *)&ret);
                      if (bVar18) goto LAB_0028b7d1;
                      ::std::__cxx11::string::string
                                ((string *)&ret_1,"Convert Property {} failed: {}\n",
                                 (allocator *)&ts_1);
                      fmt::format<char[12],std::__cxx11::string>
                                ((string *)&pvar,(fmt *)&ret_1,(string *)0x3336ca,
                                 (char (*) [12])&ret,in_R8);
                    }
                  }
                  _ss_e = (char *)&local_600;
                  ppvVar1 = &pvar._value.v_.vtable;
                  if ((vtable_type **)pvar._value.v_.storage.dynamic == ppvVar1) {
                    local_600._8_8_ = CONCAT71(pvar._25_7_,pvar._blocked);
                  }
                  else {
                    _ss_e = (char *)pvar._value.v_.storage.dynamic;
                  }
                  local_600._M_allocated_capacity._1_7_ = pvar._value.v_.vtable._1_7_;
                  local_600._M_local_buf[0] = pvar._value.v_.vtable._0_1_;
                  pvar._value.v_.storage._8_8_ = 0;
                  pvar._value.v_.vtable._0_1_ = 0;
                  pvar._value.v_.storage.dynamic = ppvVar1;
                  nonstd::expected_lite::
                  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::
                  expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                            ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&toks,(unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&ss_e);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
              }
              else {
                _ss_e = (char *)&local_600;
                local_600._M_allocated_capacity =
                     local_600._M_allocated_capacity & 0xffffffffffffff00;
                bVar18 = ::std::operator==(attr_name,"inputs:varname");
                if (bVar18) {
                  pTVar67 = (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&(pUVar42->fallback)._blocked;
                  psVar66 = extraout_RDX_06;
LAB_00288d2e:
                  (anonymous_namespace)::ToProperty<std::__cxx11::string>(pTVar67,out_prop,psVar66);
LAB_00288d6a:
                  uVar72 = 1;
                }
                else {
LAB_00288d3b:
                  cVar23 = ::std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                   *)&(pUVar42->super_ShaderNode).super_UsdShadePrim.props,attr_name
                                 );
                  if ((_Rb_tree_header *)cVar23._M_node !=
                      &(pUVar42->super_ShaderNode).super_UsdShadePrim.props._M_t._M_impl.
                       super__Rb_tree_header) {
                    Property::operator=(out_prop,(Property *)(cVar23._M_node + 2));
                    goto LAB_00288d6a;
                  }
                  uVar72 = 0;
                }
                local_978 = true;
                toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)CONCAT71(toks.
                                       super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                       ._M_impl.super__Vector_impl_data._M_start._1_7_,uVar72);
              }
LAB_00288d80:
              ::std::__cxx11::string::_M_dispose();
            }
            else {
              _ss_e = (char *)&local_600;
              local_600._M_allocated_capacity = local_600._M_allocated_capacity & 0xffffffffffffff00
              ;
              bVar18 = ::std::operator==(attr_name,"inputs:varname");
              if (bVar18) {
                pTVar67 = &pUVar33->varname;
                psVar66 = extraout_RDX_03;
LAB_002882e3:
                (anonymous_namespace)::ToProperty<std::__cxx11::string>(pTVar67,out_prop,psVar66);
LAB_002882ee:
                uVar72 = 1;
              }
              else {
                cVar23 = ::std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                         ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                 *)&(pUVar33->super_ShaderNode).super_UsdShadePrim.props,attr_name);
                if ((_Rb_tree_header *)cVar23._M_node ==
                    &(pUVar33->super_ShaderNode).super_UsdShadePrim.props._M_t._M_impl.
                     super__Rb_tree_header) {
                  uVar72 = 0;
                }
                else {
                  Property::operator=(out_prop,(Property *)(cVar23._M_node + 2));
                  uVar72 = 1;
                }
              }
LAB_002888a3:
              local_978 = true;
              toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT71(toks.
                                     super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,uVar72);
              ::std::__cxx11::string::_M_dispose();
            }
          }
          if (local_978 == true) {
            pvVar26 = nonstd::expected_lite::
                      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&toks);
            if (*pvVar26 != false) {
              pPVar69 = (PrimVar *)&toks;
              goto LAB_002869c3;
            }
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar27 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar27 = ::std::operator<<(poVar27,
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                       );
            poVar27 = ::std::operator<<(poVar27,":");
            poVar27 = ::std::operator<<(poVar27,"GetProperty");
            poVar27 = ::std::operator<<(poVar27,"():");
            poVar27 = (ostream *)::std::ostream::operator<<(poVar27,0x794);
            ::std::operator<<(poVar27," ");
            ::std::__cxx11::string::string
                      ((string *)&pvar,"Attribute `{}` does not exist in Prim {}({})",
                       (allocator *)&ts_1);
            tinyusdz::value::TypeTraits<tinyusdz::Shader>::type_name_abi_cxx11_();
            fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                      ((string *)&ret,(fmt *)&pvar,attr_name,&(prim->_elementPath)._prim_part,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret_1,
                       in_R9);
            poVar27 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
            ::std::operator<<(poVar27,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar27 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar27 = ::std::operator<<(poVar27,
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                       );
            poVar27 = ::std::operator<<(poVar27,":");
            poVar27 = ::std::operator<<(poVar27,"GetProperty");
            poVar27 = ::std::operator<<(poVar27,"():");
            poVar27 = (ostream *)::std::ostream::operator<<(poVar27,0x794);
            ::std::operator<<(poVar27," ");
            peVar24 = nonstd::expected_lite::
                      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&toks);
            poVar27 = ::std::operator<<((ostream *)&ss_e,(string *)peVar24);
            ::std::operator<<(poVar27,"\n");
          }
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          pPVar69 = (PrimVar *)&toks;
          goto LAB_002876d7;
        }
        pvVar5 = (prim->_data).v_.vtable;
        if (pvVar5 == (vtable_type *)0x0) goto LAB_002893f3;
        uVar20 = (*pvVar5->type_id)();
        if (uVar20 == 0x802) {
          pMVar34 = Prim::as<tinyusdz::Material>(prim);
          if (out_prop == (Property *)0x0) {
            _ss_e = "[InternalError] nullptr in output Property is not allowed.";
            nonstd::expected_lite::
            expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::expected<const_char_*,_0>
                      ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&pvar,(unexpected_type<const_char_*> *)&ss_e);
            if (((byte)pvar._ts._samples.
                       super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       ._M_impl.super__Vector_impl_data._M_start & 1) != 0) goto LAB_00288ec9;
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar27 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar27 = ::std::operator<<(poVar27,
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                       );
            poVar27 = ::std::operator<<(poVar27,":");
            poVar27 = ::std::operator<<(poVar27,"GetProperty");
            poVar27 = ::std::operator<<(poVar27,"():");
            poVar27 = (ostream *)::std::ostream::operator<<(poVar27,0x795);
            ::std::operator<<(poVar27," ");
            peVar24 = nonstd::expected_lite::
                      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&pvar);
            poVar27 = ::std::operator<<((ostream *)&ss_e,(string *)peVar24);
            ::std::operator<<(poVar27,"\n");
          }
          else {
            bVar18 = ::std::operator==(attr_name,"outputs:surface");
            if (bVar18) {
              if ((pMVar34->surface)._authored == true) {
                Attribute::Attribute((Attribute *)&ret);
                tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
                ::std::__cxx11::string::_M_assign(local_890);
                ::std::__cxx11::string::_M_dispose();
                ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                          (&local_830,&(pMVar34->surface)._targetPaths);
                AttrMetas::operator=(&local_818,&(pMVar34->surface)._metas);
                Property::Property((Property *)&ss_e,(Attribute *)&ret,false);
                Property::operator=(out_prop,(Property *)&ss_e);
                Property::~Property((Property *)&ss_e);
                out_prop->_listOpQual = (pMVar34->surface)._listOpQual;
LAB_00288c3e:
                Attribute::~Attribute((Attribute *)&ret);
LAB_00288c43:
                pvar._ts._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start._0_1_ = 1;
                pvar._value.v_.storage._0_1_ = 1;
                goto LAB_00288ec9;
              }
            }
            else {
              bVar18 = ::std::operator==(attr_name,"outputs:displacement");
              if (bVar18) {
                if ((pMVar34->displacement)._authored == true) {
                  Attribute::Attribute((Attribute *)&ret);
                  tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
                  ::std::__cxx11::string::_M_assign(local_890);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                            (&local_830,&(pMVar34->displacement)._targetPaths);
                  AttrMetas::operator=(&local_818,&(pMVar34->displacement)._metas);
                  Property::Property((Property *)&ss_e,(Attribute *)&ret,false);
                  Property::operator=(out_prop,(Property *)&ss_e);
                  Property::~Property((Property *)&ss_e);
                  LVar21 = (pMVar34->displacement)._listOpQual;
LAB_00288c35:
                  out_prop->_listOpQual = LVar21;
                  goto LAB_00288c3e;
                }
              }
              else {
                bVar18 = ::std::operator==(attr_name,"outputs:volume");
                if (bVar18) {
                  if ((pMVar34->volume)._authored == true) {
                    Attribute::Attribute((Attribute *)&ret);
                    tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
                    ::std::__cxx11::string::_M_assign(local_890);
                    ::std::__cxx11::string::_M_dispose();
                    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                              (&local_830,&(pMVar34->volume)._targetPaths);
                    AttrMetas::operator=(&local_818,&(pMVar34->volume)._metas);
                    Property::Property((Property *)&ss_e,(Attribute *)&ret,false);
                    Property::operator=(out_prop,(Property *)&ss_e);
                    Property::~Property((Property *)&ss_e);
                    LVar21 = (pMVar34->volume)._listOpQual;
                    goto LAB_00288c35;
                  }
                }
                else {
                  cVar23 = ::std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                   *)&(pMVar34->super_UsdShadePrim).props,attr_name);
                  if ((_Rb_tree_header *)cVar23._M_node !=
                      &(pMVar34->super_UsdShadePrim).props._M_t._M_impl.super__Rb_tree_header) {
                    Property::operator=(out_prop,(Property *)(cVar23._M_node + 2));
                    goto LAB_00288c43;
                  }
                }
              }
            }
            pvar._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start._0_1_ = 1;
            pvar._value.v_.storage.dynamic = pvar._value.v_.storage.dynamic & 0xffffffffffffff00;
LAB_00288ec9:
            pvVar26 = nonstd::expected_lite::
                      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&pvar);
            if (*pvVar26 != false) {
LAB_00288ed8:
              pPVar69 = &pvar;
              goto LAB_002869c3;
            }
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar27 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar27 = ::std::operator<<(poVar27,
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                       );
            poVar27 = ::std::operator<<(poVar27,":");
            poVar27 = ::std::operator<<(poVar27,"GetProperty");
            poVar27 = ::std::operator<<(poVar27,"():");
            poVar27 = (ostream *)::std::ostream::operator<<(poVar27,0x795);
            ::std::operator<<(poVar27," ");
            ::std::__cxx11::string::string
                      ((string *)&ret_1,"Attribute `{}` does not exist in Prim {}({})",
                       (allocator *)&ts_1);
            tinyusdz::value::TypeTraits<tinyusdz::Material>::type_name_abi_cxx11_();
            fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                      ((string *)&ret,(fmt *)&ret_1,attr_name,&(prim->_elementPath)._prim_part,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&toks,
                       in_R9);
            poVar27 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
            ::std::operator<<(poVar27,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
LAB_00289000:
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
          }
LAB_00289010:
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          pPVar69 = &pvar;
          goto LAB_002876d7;
        }
        pvVar5 = (prim->_data).v_.vtable;
        if (pvVar5 == (vtable_type *)0x0) goto LAB_002893f3;
        uVar20 = (*pvVar5->type_id)();
        if (uVar20 == 0x2001) {
          pSVar39 = Prim::as<tinyusdz::SkelRoot>(prim);
          if (out_prop == (Property *)0x0) {
            _ss_e = "[InternalError] nullptr in output Property is not allowed.";
            nonstd::expected_lite::
            expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::expected<const_char_*,_0>(&ret,(unexpected_type<const_char_*> *)&ss_e);
            if ((ret.contained.
                 super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._32_4_ & 1) != 0) goto LAB_00289037;
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar27 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar27 = ::std::operator<<(poVar27,
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                       );
            poVar27 = ::std::operator<<(poVar27,":");
            poVar27 = ::std::operator<<(poVar27,"GetProperty");
            poVar27 = ::std::operator<<(poVar27,"():");
            iVar68 = 0x796;
LAB_0028b35e:
            poVar27 = (ostream *)::std::ostream::operator<<(poVar27,iVar68);
            ::std::operator<<(poVar27," ");
            peVar24 = nonstd::expected_lite::
                      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::error(&ret);
            poVar27 = ::std::operator<<((ostream *)&ss_e,(string *)peVar24);
            ::std::operator<<(poVar27,"\n");
          }
          else {
            cVar23 = ::std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                             *)&pSVar39->props,attr_name);
            if ((_Rb_tree_header *)cVar23._M_node ==
                &(pSVar39->props)._M_t._M_impl.super__Rb_tree_header) {
              ret.contained.
              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .m_has_value = true;
              ret.contained.
              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0.m_error._M_dataplus._M_p =
                   (_Alloc_hider)
                   ((ulong)ret.contained.
                           super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .field_0.m_error._M_dataplus._M_p & 0xffffffffffffff00);
            }
            else {
              Property::operator=(out_prop,(Property *)(cVar23._M_node + 2));
              ret.contained.
              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .m_has_value = true;
              ret.contained.
              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0.m_value = true;
            }
LAB_00289037:
            pvVar26 = nonstd::expected_lite::
                      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::value(&ret);
            if (*pvVar26 != false) goto LAB_002869bb;
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar27 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar27 = ::std::operator<<(poVar27,
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                       );
            poVar27 = ::std::operator<<(poVar27,":");
            poVar27 = ::std::operator<<(poVar27,"GetProperty");
            poVar27 = ::std::operator<<(poVar27,"():");
            poVar27 = (ostream *)::std::ostream::operator<<(poVar27,0x796);
            ::std::operator<<(poVar27," ");
            ::std::__cxx11::string::string
                      ((string *)&ret_1,"Attribute `{}` does not exist in Prim {}({})",
                       (allocator *)&ts_1);
            tinyusdz::value::TypeTraits<tinyusdz::SkelRoot>::type_name_abi_cxx11_();
LAB_00289108:
            fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                      ((string *)&pvar,(fmt *)&ret_1,attr_name,&(prim->_elementPath)._prim_part,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&toks,
                       in_R9);
            poVar27 = ::std::operator<<((ostream *)&ss_e,(string *)&pvar);
            ::std::operator<<(poVar27,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            goto LAB_00286ae4;
          }
          goto LAB_00286af4;
        }
        pvVar5 = (prim->_data).v_.vtable;
        if (pvVar5 == (vtable_type *)0x0) goto LAB_002893f3;
        uVar20 = (*pvVar5->type_id)();
        if (uVar20 == 0x2004) {
          pBVar41 = Prim::as<tinyusdz::BlendShape>(prim);
          if (out_prop == (Property *)0x0) {
            _ss_e = "[InternalError] nullptr in output Property is not allowed.";
            nonstd::expected_lite::
            expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::expected<const_char_*,_0>
                      ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&pvar,(unexpected_type<const_char_*> *)&ss_e);
          }
          else {
            err_1._M_dataplus._M_p = (pointer)&err_1.field_2;
            err_1._M_string_length = 0;
            err_1.field_2._M_allocated_capacity =
                 err_1.field_2._M_allocated_capacity & 0xffffffffffffff00;
            bVar18 = ::std::operator==(attr_name,"offsets");
            if (bVar18) {
              bVar18 = (anonymous_namespace)::
                       ToProperty<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                                 (&pBVar41->offsets,out_prop,&err_1);
              if (bVar18) goto LAB_0028a753;
              ::std::__cxx11::string::string
                        ((string *)&ret_1,"Convert Property {} failed: {}\n",(allocator *)&toks);
              fmt::format<char[8],std::__cxx11::string>
                        ((string *)&ret,(fmt *)&ret_1,(string *)"offsets",(char (*) [8])&err_1,in_R8
                        );
LAB_002892b5:
              _ss_e = (char *)&local_600;
              _Var2._M_p = (pointer)((long)&ret.contained.
                                            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            .field_0 + 0x10);
              if (ret.contained.
                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .field_0.m_error._M_dataplus._M_p == (_Alloc_hider)_Var2._M_p) {
                local_600._8_8_ =
                     ret.contained.
                     super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .field_0._24_8_;
              }
              else {
                _ss_e = (char *)ret.contained.
                                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                .field_0.m_error._M_dataplus._M_p;
              }
              local_600._M_allocated_capacity._1_7_ =
                   ret.contained.
                   super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .field_0._17_7_;
              local_600._M_local_buf[0] =
                   ret.contained.
                   super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .field_0._16_1_;
              ret.contained.
              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0.m_error._M_string_length = 0;
              ret.contained.
              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0._16_1_ = 0;
              ret.contained.
              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0.m_error._M_dataplus._M_p = (_Alloc_hider)_Var2._M_p;
              nonstd::expected_lite::
              expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::
              expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&pvar,(unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&ss_e);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            else {
              bVar18 = ::std::operator==(attr_name,"normalOffsets");
              if (bVar18) {
                bVar18 = (anonymous_namespace)::
                         ToProperty<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                                   (&pBVar41->normalOffsets,out_prop,&err_1);
                if (!bVar18) {
                  ::std::__cxx11::string::string
                            ((string *)&ret_1,"Convert Property {} failed: {}\n",(allocator *)&toks)
                  ;
                  fmt::format<char[14],std::__cxx11::string>
                            ((string *)&ret,(fmt *)&ret_1,(string *)"normalOffsets",
                             (char (*) [14])&err_1,in_R8);
                  goto LAB_002892b5;
                }
              }
              else {
                bVar18 = ::std::operator==(attr_name,"pointIndices");
                if (bVar18) {
                  Attribute::Attribute((Attribute *)&ret);
                  ret.contained.
                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .m_has_value = true;
                  ret.contained.
                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._33_3_ = 0;
                  tinyusdz::value::TypeTraits<std::vector<int,std::allocator<int>>>::
                  type_name_abi_cxx11_();
                  ::std::__cxx11::string::_M_assign(local_890);
                  ::std::__cxx11::string::_M_dispose();
                  if ((pBVar41->pointIndices)._blocked == true) {
                    local_858 = true;
                  }
                  if ((pBVar41->pointIndices)._paths.
                      super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                      super__Vector_impl_data._M_finish !=
                      (pBVar41->pointIndices)._paths.
                      super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                      super__Vector_impl_data._M_start) {
                    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                              (&local_830,&(pBVar41->pointIndices)._paths);
                  }
                  if ((pBVar41->pointIndices)._attrib.has_value_ == true) {
                    nonstd::optional_lite::optional<std::vector<int,_std::allocator<int>_>_>::
                    optional((optional<std::vector<int,_std::allocator<int>_>_> *)&ret_1,
                             &(pBVar41->pointIndices)._attrib);
                    uVar72 = ret_1.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .field_0.m_value;
                    if (ret_1.contained.
                        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .field_0.m_value == true) {
                      value_00 = nonstd::optional_lite::
                                 optional<std::vector<int,_std::allocator<int>_>_>::value
                                           ((optional<std::vector<int,_std::allocator<int>_>_> *)
                                            &ret_1);
                      linb::any::construct<std::vector<int,std::allocator<int>>const&>
                                ((any *)&toks,value_00);
                      local_600._M_allocated_capacity =
                           (size_type)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
                      _ss_e = (char *)0x0;
                      local_600._8_8_ = local_600._8_8_ & 0xffffffffffffff00;
                      local_5f0[0]._samples.
                      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      local_5f0[0]._samples.
                      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                      local_5f0[0]._samples.
                      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                      local_5f0[0]._samples.
                      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                      local_5f0[0]._17_8_ = 0;
                      linb::any::operator=((any *)&ss_e,(any *)&toks);
                      Attribute::set_var((Attribute *)&ret,(PrimVar *)&ss_e);
                      primvar::PrimVar::~PrimVar((PrimVar *)&ss_e);
                      if (CONCAT71(toks.
                                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                   toks.
                                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) != 0) {
                        (**(code **)(CONCAT71(toks.
                                              super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                              _1_7_,toks.
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._0_1_) + 0x20))(&toks);
                      }
                    }
                    else {
                      ::std::__cxx11::string::string
                                ((string *)&toks,"[InternalError] Invalid TypedAttribute<{}> value."
                                 ,&local_929);
                      tinyusdz::value::TypeTraits<std::vector<int,std::allocator<int>>>::
                      type_name_abi_cxx11_();
                      fmt::format<std::__cxx11::string>
                                ((string *)&ss_e,(fmt *)&toks,(string *)&ts_1,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)psVar66);
                      ::std::__cxx11::string::append((string *)&err_1);
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                    }
                    nonstd::optional_lite::optional<std::vector<int,_std::allocator<int>_>_>::
                    ~optional((optional<std::vector<int,_std::allocator<int>_>_> *)&ret_1);
                    if ((value_type_conflict)uVar72 == false) {
                      Attribute::~Attribute((Attribute *)&ret);
                      ::std::__cxx11::string::string
                                ((string *)&ret_1,"Convert Property {} failed: {}\n",
                                 (allocator *)&toks);
                      fmt::format<char[13],std::__cxx11::string>
                                ((string *)&ret,(fmt *)&ret_1,(string *)"pointIndices",
                                 (char (*) [13])&err_1,in_R8);
                      goto LAB_002892b5;
                    }
                  }
                  AttrMetas::operator=(&local_818,&(pBVar41->pointIndices)._metas);
                  Property::Property((Property *)&ss_e,(Attribute *)&ret,false);
                  Property::operator=(out_prop,(Property *)&ss_e);
                  Property::~Property((Property *)&ss_e);
                  Attribute::~Attribute((Attribute *)&ret);
                }
                else {
                  cVar23 = ::std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                   *)&pBVar41->props,attr_name);
                  if ((_Rb_tree_header *)cVar23._M_node ==
                      &(pBVar41->props)._M_t._M_impl.super__Rb_tree_header) {
                    pvar._ts._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start._0_1_ = 1;
                    pvar._value.v_.storage.dynamic =
                         pvar._value.v_.storage.dynamic & 0xffffffffffffff00;
                    goto LAB_0028a75d;
                  }
                  Property::operator=(out_prop,(Property *)(cVar23._M_node + 2));
                }
              }
LAB_0028a753:
              pvar._ts._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_start._0_1_ = 1;
              pvar._value.v_.storage._0_1_ = 1;
            }
LAB_0028a75d:
            ::std::__cxx11::string::_M_dispose();
          }
          if ((byte)pvar._ts._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start == 1) {
            pvVar26 = nonstd::expected_lite::
                      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&pvar);
            if (*pvVar26 == false) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar27 = ::std::operator<<((ostream *)&ss_e,"[error]");
              poVar27 = ::std::operator<<(poVar27,
                                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                         );
              poVar27 = ::std::operator<<(poVar27,":");
              poVar27 = ::std::operator<<(poVar27,"GetProperty");
              poVar27 = ::std::operator<<(poVar27,"():");
              poVar27 = (ostream *)::std::ostream::operator<<(poVar27,0x797);
              ::std::operator<<(poVar27," ");
              ::std::__cxx11::string::string
                        ((string *)&ret_1,"Attribute `{}` does not exist in Prim {}({})",
                         (allocator *)&ts_1);
              tinyusdz::value::TypeTraits<tinyusdz::BlendShape>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                        ((string *)&ret,(fmt *)&ret_1,attr_name,&(prim->_elementPath)._prim_part,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&toks,
                         in_R9);
              poVar27 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
              ::std::operator<<(poVar27,"\n");
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              goto LAB_0028a926;
            }
            goto LAB_00288ed8;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar27 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar27 = ::std::operator<<(poVar27,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                     );
          poVar27 = ::std::operator<<(poVar27,":");
          poVar27 = ::std::operator<<(poVar27,"GetProperty");
          poVar27 = ::std::operator<<(poVar27,"():");
          poVar27 = (ostream *)::std::ostream::operator<<(poVar27,0x797);
          ::std::operator<<(poVar27," ");
          peVar24 = nonstd::expected_lite::
                    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&pvar);
          poVar27 = ::std::operator<<((ostream *)&ss_e,(string *)peVar24);
          ::std::operator<<(poVar27,"\n");
LAB_0028a926:
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            goto LAB_00289000;
          }
          goto LAB_00289010;
        }
        pvVar5 = (prim->_data).v_.vtable;
        if (pvVar5 == (vtable_type *)0x0) goto LAB_002893f3;
        uVar20 = (*pvVar5->type_id)();
        if (uVar20 == 0x2002) {
          pSVar43 = Prim::as<tinyusdz::Skeleton>(prim);
          if (out_prop == (Property *)0x0) {
            _ss_e = "[InternalError] nullptr in output Property is not allowed.";
            nonstd::expected_lite::
            expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::expected<const_char_*,_0>(&ret,(unexpected_type<const_char_*> *)&ss_e);
          }
          else {
            pvar._value.v_.storage.dynamic = &pvar._value.v_.vtable;
            pvar._value.v_.storage._8_8_ = 0;
            pvar._value.v_.vtable._0_1_ = 0;
            bVar18 = ::std::operator==(attr_name,"bindTransforms");
            if (bVar18) {
              bVar18 = (anonymous_namespace)::
                       ToProperty<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
                                 (&pSVar43->bindTransforms,out_prop,(string *)&pvar);
              if (bVar18) goto LAB_0028b1fa;
              ::std::__cxx11::string::string
                        ((string *)&toks,"Convert Property {} failed: {}\n",(allocator *)&ts_1);
              pcVar64 = "bindTransforms";
LAB_00288e3a:
              fmt::format<char[15],std::__cxx11::string>
                        ((string *)&ret_1,(fmt *)&toks,(string *)pcVar64,(char (*) [15])&pvar,in_R8)
              ;
LAB_0028a282:
              _ss_e = (char *)&local_600;
              _Var2._M_p = (pointer)((long)&ret_1.contained.
                                            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            .field_0 + 0x10);
              if (ret_1.contained.
                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .field_0.m_error._M_dataplus._M_p == (_Alloc_hider)_Var2._M_p) {
                local_600._8_8_ =
                     CONCAT71(ret_1.contained.
                              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              .field_0._25_7_,
                              ret_1.contained.
                              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              .field_0._24_1_);
              }
              else {
                _ss_e = (char *)ret_1.contained.
                                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                .field_0.m_error._M_dataplus._M_p;
              }
              local_600._M_allocated_capacity._1_7_ =
                   ret_1.contained.
                   super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .field_0._17_7_;
              local_600._M_local_buf[0] =
                   ret_1.contained.
                   super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .field_0._16_1_;
              ret_1.contained.
              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0.m_error._M_string_length._0_4_ = 0;
              ret_1.contained.
              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0.m_error._M_string_length._4_4_ = 0;
              ret_1.contained.
              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0._16_1_ = 0;
              ret_1.contained.
              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0.m_error._M_dataplus._M_p = (_Alloc_hider)_Var2._M_p;
              nonstd::expected_lite::
              expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::
              expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&ret,(unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&ss_e);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            else {
              bVar18 = ::std::operator==(attr_name,"jointNames");
              if (bVar18) {
                bVar18 = (anonymous_namespace)::
                         ToProperty<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                                   (&pSVar43->jointNames,out_prop,(string *)&pvar);
                if (!bVar18) {
                  ::std::__cxx11::string::string
                            ((string *)&toks,"Convert Property {} failed: {}\n",(allocator *)&ts_1);
                  fmt::format<char[11],std::__cxx11::string>
                            ((string *)&ret_1,(fmt *)&toks,(string *)"jointNames",
                             (char (*) [11])&pvar,in_R8);
                  goto LAB_0028a282;
                }
              }
              else {
                bVar18 = ::std::operator==(attr_name,"joints");
                if (bVar18) {
                  bVar18 = (anonymous_namespace)::
                           ToProperty<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                                     (&pSVar43->joints,out_prop,(string *)&pvar);
                  if (!bVar18) {
                    ::std::__cxx11::string::string
                              ((string *)&toks,"Convert Property {} failed: {}\n",(allocator *)&ts_1
                              );
                    fmt::format<char[7],std::__cxx11::string>
                              ((string *)&ret_1,(fmt *)&toks,(string *)"joints",(char (*) [7])&pvar,
                               in_R8);
                    goto LAB_0028a282;
                  }
                }
                else {
                  bVar18 = ::std::operator==(attr_name,"restTransforms");
                  if (bVar18) {
                    bVar18 = (anonymous_namespace)::
                             ToProperty<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
                                       (&pSVar43->restTransforms,out_prop,(string *)&pvar);
                    if (!bVar18) {
                      ::std::__cxx11::string::string
                                ((string *)&toks,"Convert Property {} failed: {}\n",
                                 (allocator *)&ts_1);
                      pcVar64 = "restTransforms";
                      goto LAB_00288e3a;
                    }
                  }
                  else {
                    bVar18 = ::std::operator==(attr_name,"animationSource");
                    if (bVar18) {
                      if ((pSVar43->animationSource).has_value_ != true) {
LAB_0028b3c4:
                        ret.contained.
                        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .m_has_value = true;
                        ret.contained.
                        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .field_0.m_error._M_dataplus._M_p =
                             (_Alloc_hider)
                             ((ulong)ret.contained.
                                     super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     .field_0.m_error._M_dataplus._M_p & 0xffffffffffffff00);
                        goto LAB_0028b20a;
                      }
                      pvVar53 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                                          (&pSVar43->animationSource);
                      Property::Property((Property *)&ss_e,pvVar53,false);
                      Property::operator=(out_prop,(Property *)&ss_e);
                      Property::~Property((Property *)&ss_e);
                    }
                    else {
                      cVar23 = ::std::
                               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                       *)&pSVar43->props,attr_name);
                      if ((_Rb_tree_header *)cVar23._M_node ==
                          &(pSVar43->props)._M_t._M_impl.super__Rb_tree_header) goto LAB_0028b3c4;
                      Property::operator=(out_prop,(Property *)(cVar23._M_node + 2));
                    }
                  }
                }
              }
LAB_0028b1fa:
              ret.contained.
              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .m_has_value = true;
              ret.contained.
              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0.m_value = true;
            }
LAB_0028b20a:
            ::std::__cxx11::string::_M_dispose();
          }
          if (ret.contained.
              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .m_has_value != true) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar27 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar27 = ::std::operator<<(poVar27,
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                       );
            poVar27 = ::std::operator<<(poVar27,":");
            poVar27 = ::std::operator<<(poVar27,"GetProperty");
            poVar27 = ::std::operator<<(poVar27,"():");
            iVar68 = 0x798;
            goto LAB_0028b35e;
          }
          pvVar26 = nonstd::expected_lite::
                    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::value(&ret);
          if (*pvVar26 != false) goto LAB_002869bb;
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar27 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar27 = ::std::operator<<(poVar27,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                     );
          poVar27 = ::std::operator<<(poVar27,":");
          poVar27 = ::std::operator<<(poVar27,"GetProperty");
          poVar27 = ::std::operator<<(poVar27,"():");
          poVar27 = (ostream *)::std::ostream::operator<<(poVar27,0x798);
          ::std::operator<<(poVar27," ");
          ::std::__cxx11::string::string
                    ((string *)&ret_1,"Attribute `{}` does not exist in Prim {}({})",
                     (allocator *)&ts_1);
          tinyusdz::value::TypeTraits<tinyusdz::Skeleton>::type_name_abi_cxx11_();
          goto LAB_00289108;
        }
        pvVar5 = (prim->_data).v_.vtable;
        if ((pvVar5 == (vtable_type *)0x0) || (uVar20 = (*pvVar5->type_id)(), uVar20 != 0x2003))
        goto LAB_002893f3;
        pSVar45 = Prim::as<tinyusdz::SkelAnimation>(prim);
        if (out_prop == (Property *)0x0) {
          _ss_e = "[InternalError] nullptr in output Property is not allowed.";
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::expected<const_char_*,_0>(&ret_1,(unexpected_type<const_char_*> *)&ss_e);
        }
        else {
          ts_1._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)&ts_1._samples.
                         super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          ts_1._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
          ts_1._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
          ts_1._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          bVar18 = ::std::operator==(attr_name,"blendShapes");
          if (bVar18) {
            bVar18 = (anonymous_namespace)::
                     ToProperty<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                               (&pSVar45->blendShapes,out_prop,(string *)&ts_1);
            if (bVar18) goto LAB_0028bf47;
            ::std::__cxx11::string::string
                      ((string *)&pvar,"Convert Property {} failed: {}\n",(allocator *)&toks);
            fmt::format<char[12],std::__cxx11::string>
                      ((string *)&ret,(fmt *)&pvar,(string *)0x3332d6,(char (*) [12])&ts_1,in_R8);
LAB_002893b6:
            _ss_e = (char *)&local_600;
            _Var2._M_p = (pointer)((long)&ret.contained.
                                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          .field_0 + 0x10);
            if (ret.contained.
                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .field_0.m_error._M_dataplus._M_p == (_Alloc_hider)_Var2._M_p) {
              local_600._8_8_ =
                   ret.contained.
                   super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .field_0._24_8_;
            }
            else {
              _ss_e = (char *)ret.contained.
                              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              .field_0.m_error._M_dataplus._M_p;
            }
            local_600._M_allocated_capacity._1_7_ =
                 ret.contained.
                 super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .field_0._17_7_;
            local_600._M_local_buf[0] =
                 ret.contained.
                 super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .field_0._16_1_;
            ret.contained.
            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .field_0.m_error._M_string_length = 0;
            ret.contained.
            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .field_0._16_1_ = 0;
            ret.contained.
            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .field_0.m_error._M_dataplus._M_p = (_Alloc_hider)_Var2._M_p;
            nonstd::expected_lite::
            expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&ret_1,(unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&ss_e);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          else {
            bVar18 = ::std::operator==(attr_name,"blendShapeWeights");
            if (bVar18) {
              (anonymous_namespace)::ToProperty<std::vector<float,std::allocator<float>>>
                        (&pSVar45->blendShapeWeights,out_prop,err_03);
            }
            else {
              bVar18 = ::std::operator==(attr_name,"joints");
              if (bVar18) {
                bVar18 = (anonymous_namespace)::
                         ToProperty<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                                   (&pSVar45->joints,out_prop,(string *)&ts_1);
                if (!bVar18) {
                  ::std::__cxx11::string::string
                            ((string *)&pvar,"Convert Property {} failed: {}\n",(allocator *)&toks);
                  fmt::format<char[7],std::__cxx11::string>
                            ((string *)&ret,(fmt *)&pvar,(string *)"joints",(char (*) [7])&ts_1,
                             in_R8);
                  goto LAB_002893b6;
                }
              }
              else {
                bVar18 = ::std::operator==(attr_name,"rotations");
                if (bVar18) {
                  Attribute::Attribute((Attribute *)&ret);
                  ret.contained.
                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .m_has_value = false;
                  ret.contained.
                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._33_3_ = 0;
                  tinyusdz::value::
                  TypeTraits<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
                  ::type_name_abi_cxx11_();
                  ::std::__cxx11::string::_M_assign(local_890);
                  ::std::__cxx11::string::_M_dispose();
                  if ((pSVar45->rotations)._blocked == true) {
                    local_858 = true;
                  }
                  if ((pSVar45->rotations)._paths.
                      super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                      super__Vector_impl_data._M_finish !=
                      (pSVar45->rotations)._paths.
                      super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                      super__Vector_impl_data._M_start) {
                    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                              (&local_830,&(pSVar45->rotations)._paths);
                  }
                  local_938 = &(pSVar45->rotations)._metas;
                  pvar._value.v_.vtable._0_1_ = 0x60;
                  pvar._value.v_.vtable._1_7_ = 0x3f04;
                  pvar._value.v_.storage.dynamic = (void *)0x0;
                  pvar._blocked = false;
                  pvar._ts._samples.
                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
                  pvar._ts._samples.
                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_start._1_7_ = 0;
                  pvar._ts._samples.
                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                  pvar._ts._samples.
                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                  pvar._ts._samples.
                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                  pvar._ts._17_8_ = 0;
                  nonstd::optional_lite::
                  optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                  ::optional((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                              *)&ss_e,&(pSVar45->rotations)._attrib);
                  if (ss_e == (ostringstream)0x1) {
                    pvVar54 = nonstd::optional_lite::
                              optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                              ::value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                                       *)&ss_e);
                    if (pvVar54->_blocked == true) {
                      local_858 = true;
                    }
                    pvVar54 = nonstd::optional_lite::
                              optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                              ::value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                                       *)&ss_e);
                    if (pvVar54->_has_value == true) {
                      toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                      _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                      toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                      _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                      toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                      toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
                      pvVar54 = nonstd::optional_lite::
                                optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                                ::value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                                         *)&ss_e);
                      bVar18 = Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                               ::get_scalar(pvVar54,(
                                                  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                                  *)&toks);
                      if (bVar18) {
                        linb::any::
                        construct<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>const&>
                                  ((any *)&err_1,
                                   (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                    *)&toks);
                        linb::any::operator=((any *)&pvar,(any *)&err_1);
                        if (err_1.field_2._M_allocated_capacity != 0) {
                          (**(code **)(err_1.field_2._M_allocated_capacity + 0x20))(&err_1);
                        }
                      }
                      ::std::
                      _Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                      ::~_Vector_base((_Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                       *)&toks);
                    }
                    pvVar54 = nonstd::optional_lite::
                              optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                              ::value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                                       *)&ss_e);
                    bVar18 = Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                             ::has_timesamples(pvVar54);
                    if (bVar18) {
                      pvVar54 = nonstd::optional_lite::
                                optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                                ::value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                                         *)&ss_e);
                      pvVar55 = TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                                ::get_samples(&pvVar54->_ts);
                      toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                      _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                      toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                      _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                      toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                      toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
                      lVar71 = 8;
                      for (uVar73 = 0;
                          pSVar13 = (pvVar55->
                                    super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                                    )._M_impl.super__Vector_impl_data._M_start,
                          uVar73 < (ulong)(((long)(pvVar55->
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                           (long)pSVar13) / 0x28); uVar73 = uVar73 + 1) {
                        dVar3 = *(double *)((long)pSVar13 + lVar71 + -8);
                        linb::any::
                        construct<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>const&>
                                  ((any *)&err_1,
                                   (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                    *)((long)&pSVar13->t + lVar71));
                        tinyusdz::value::TimeSamples::add_sample
                                  ((TimeSamples *)&toks,dVar3,(Value *)&err_1);
                        if (err_1.field_2._M_allocated_capacity != 0) {
                          (**(code **)(err_1.field_2._M_allocated_capacity + 0x20))(&err_1);
                        }
                        lVar71 = lVar71 + 0x28;
                      }
                      tinyusdz::value::TimeSamples::operator=(&pvar._ts,(TimeSamples *)&toks);
                      ::std::
                      vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                      ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                 *)&toks);
                    }
                    pvVar54 = nonstd::optional_lite::
                              optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                              ::value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                                       *)&ss_e);
                    if (pvVar54->_has_value == false) {
                      pvVar54 = nonstd::optional_lite::
                                optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                                ::value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                                         *)&ss_e);
                      bVar18 = Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                               ::has_timesamples(pvVar54);
                      if (!bVar18) goto LAB_0028bc12;
                    }
                    Attribute::set_var((Attribute *)&ret,&pvar);
                  }
LAB_0028bc12:
                  nonstd::optional_lite::
                  optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                  ::~optional((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                               *)&ss_e);
                }
                else {
                  bVar18 = ::std::operator==(attr_name,"scales");
                  if (bVar18) {
                    Attribute::Attribute((Attribute *)&ret);
                    ret.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value = false;
                    ret.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._33_3_ = 0;
                    tinyusdz::value::
                    TypeTraits<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                    ::type_name_abi_cxx11_();
                    ::std::__cxx11::string::_M_assign(local_890);
                    ::std::__cxx11::string::_M_dispose();
                    if ((pSVar45->scales)._blocked == true) {
                      local_858 = true;
                    }
                    if ((pSVar45->scales)._paths.
                        super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                        super__Vector_impl_data._M_finish !=
                        (pSVar45->scales)._paths.
                        super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                        super__Vector_impl_data._M_start) {
                      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                                (&local_830,&(pSVar45->scales)._paths);
                    }
                    local_938 = &(pSVar45->scales)._metas;
                    pvar._value.v_.vtable._0_1_ = 0x60;
                    pvar._value.v_.vtable._1_7_ = 0x3f04;
                    pvar._value.v_.storage.dynamic = (void *)0x0;
                    pvar._blocked = false;
                    pvar._ts._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
                    pvar._ts._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start._1_7_ = 0;
                    pvar._ts._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                    pvar._ts._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                    pvar._ts._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                    pvar._ts._17_8_ = 0;
                    nonstd::optional_lite::
                    optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                    ::optional((optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                                *)&ss_e,&(pSVar45->scales)._attrib);
                    if (ss_e == (ostringstream)0x1) {
                      pvVar58 = nonstd::optional_lite::
                                optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                                ::value((optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                                         *)&ss_e);
                      if (pvVar58->_blocked == true) {
                        local_858 = true;
                      }
                      pvVar58 = nonstd::optional_lite::
                                optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                                ::value((optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                                         *)&ss_e);
                      if (pvVar58->_has_value == true) {
                        toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                        toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                        toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                        toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                        toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
                        pvVar58 = nonstd::optional_lite::
                                  optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                                  ::value((optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                                           *)&ss_e);
                        bVar18 = Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                                 ::get_scalar(pvVar58,(
                                                  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                                  *)&toks);
                        if (bVar18) {
                          linb::any::
                          construct<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>const&>
                                    ((any *)&err_1,
                                     (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                      *)&toks);
                          linb::any::operator=((any *)&pvar,(any *)&err_1);
                          if (err_1.field_2._M_allocated_capacity != 0) {
                            (**(code **)(err_1.field_2._M_allocated_capacity + 0x20))(&err_1);
                          }
                        }
                        ::std::
                        _Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                        ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                         *)&toks);
                      }
                      pvVar58 = nonstd::optional_lite::
                                optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                                ::value((optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                                         *)&ss_e);
                      bVar18 = Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                               ::has_timesamples(pvVar58);
                      if (bVar18) {
                        pvVar58 = nonstd::optional_lite::
                                  optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                                  ::value((optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                                           *)&ss_e);
                        pvVar59 = TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                                  ::get_samples(&pvVar58->_ts);
                        toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                        toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                        toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                        toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                        toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
                        lVar71 = 8;
                        for (uVar73 = 0;
                            pSVar15 = (pvVar59->
                                      super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
                                      )._M_impl.super__Vector_impl_data._M_start,
                            uVar73 < (ulong)(((long)(pvVar59->
                                                                                                        
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                             (long)pSVar15) / 0x28); uVar73 = uVar73 + 1) {
                          dVar3 = *(double *)((long)pSVar15 + lVar71 + -8);
                          linb::any::
                          construct<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>const&>
                                    ((any *)&err_1,
                                     (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                      *)((long)&pSVar15->t + lVar71));
                          tinyusdz::value::TimeSamples::add_sample
                                    ((TimeSamples *)&toks,dVar3,(Value *)&err_1);
                          if (err_1.field_2._M_allocated_capacity != 0) {
                            (**(code **)(err_1.field_2._M_allocated_capacity + 0x20))(&err_1);
                          }
                          lVar71 = lVar71 + 0x28;
                        }
                        tinyusdz::value::TimeSamples::operator=(&pvar._ts,(TimeSamples *)&toks);
                        ::std::
                        vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                        ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                   *)&toks);
                      }
                      pvVar58 = nonstd::optional_lite::
                                optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                                ::value((optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                                         *)&ss_e);
                      if (pvVar58->_has_value == false) {
                        pvVar58 = nonstd::optional_lite::
                                  optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                                  ::value((optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                                           *)&ss_e);
                        bVar18 = Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                                 ::has_timesamples(pvVar58);
                        if (!bVar18) goto LAB_0028bde7;
                      }
                      Attribute::set_var((Attribute *)&ret,&pvar);
                    }
LAB_0028bde7:
                    nonstd::optional_lite::
                    optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                    ::~optional((optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                                 *)&ss_e);
                  }
                  else {
                    bVar18 = ::std::operator==(attr_name,"translations");
                    if (!bVar18) {
                      cVar23 = ::std::
                               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                       *)&pSVar45->props,attr_name);
                      if ((_Rb_tree_header *)cVar23._M_node !=
                          &(pSVar45->props)._M_t._M_impl.super__Rb_tree_header) {
                        Property::operator=(out_prop,(Property *)(cVar23._M_node + 2));
                        goto LAB_0028bf47;
                      }
                      ret_1.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value = true;
                      ret_1.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .field_0.m_error._M_dataplus._M_p =
                           (_Alloc_hider)
                           ((ulong)ret_1.contained.
                                   super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   .field_0.m_error._M_dataplus._M_p & 0xffffffffffffff00);
                      goto LAB_0028bf57;
                    }
                    Attribute::Attribute((Attribute *)&ret);
                    ret.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value = false;
                    ret.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._33_3_ = 0;
                    tinyusdz::value::
                    TypeTraits<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                    ::type_name_abi_cxx11_();
                    ::std::__cxx11::string::_M_assign(local_890);
                    ::std::__cxx11::string::_M_dispose();
                    if ((pSVar45->translations)._blocked == true) {
                      local_858 = true;
                    }
                    if ((pSVar45->translations)._paths.
                        super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                        super__Vector_impl_data._M_finish !=
                        (pSVar45->translations)._paths.
                        super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                        super__Vector_impl_data._M_start) {
                      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                                (&local_830,&(pSVar45->translations)._paths);
                    }
                    local_938 = &(pSVar45->translations)._metas;
                    pvar._value.v_.vtable._0_1_ = 0x60;
                    pvar._value.v_.vtable._1_7_ = 0x3f04;
                    pvar._value.v_.storage.dynamic = (void *)0x0;
                    pvar._blocked = false;
                    pvar._ts._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
                    pvar._ts._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start._1_7_ = 0;
                    pvar._ts._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                    pvar._ts._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                    pvar._ts._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                    pvar._ts._17_8_ = 0;
                    nonstd::optional_lite::
                    optional<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                    ::optional((optional<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                                *)&ss_e,&(pSVar45->translations)._attrib);
                    if (ss_e == (ostringstream)0x1) {
                      pvVar60 = nonstd::optional_lite::
                                optional<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                                ::value((optional<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                                         *)&ss_e);
                      if (pvVar60->_blocked == true) {
                        local_858 = true;
                      }
                      pvVar60 = nonstd::optional_lite::
                                optional<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                                ::value((optional<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                                         *)&ss_e);
                      if (pvVar60->_has_value == true) {
                        toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                        toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                        toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                        toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                        toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
                        pvVar60 = nonstd::optional_lite::
                                  optional<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                                  ::value((optional<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                                           *)&ss_e);
                        bVar18 = Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                                 ::get_scalar(pvVar60,(
                                                  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  *)&toks);
                        if (bVar18) {
                          linb::any::
                          construct<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>const&>
                                    ((any *)&err_1,
                                     (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                      *)&toks);
                          linb::any::operator=((any *)&pvar,(any *)&err_1);
                          if (err_1.field_2._M_allocated_capacity != 0) {
                            (**(code **)(err_1.field_2._M_allocated_capacity + 0x20))(&err_1);
                          }
                        }
                        ::std::
                        _Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                        ::~_Vector_base((_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                         *)&toks);
                      }
                      pvVar60 = nonstd::optional_lite::
                                optional<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                                ::value((optional<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                                         *)&ss_e);
                      bVar18 = Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                               ::has_timesamples(pvVar60);
                      if (bVar18) {
                        pvVar60 = nonstd::optional_lite::
                                  optional<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                                  ::value((optional<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                                           *)&ss_e);
                        pvVar61 = TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                                  ::get_samples(&pvVar60->_ts);
                        toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                        toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                        toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                        toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                        toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
                        lVar71 = 8;
                        for (uVar73 = 0;
                            pSVar16 = (pvVar61->
                                      super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
                                      )._M_impl.super__Vector_impl_data._M_start,
                            uVar73 < (ulong)(((long)(pvVar61->
                                                                                                        
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                             (long)pSVar16) / 0x28); uVar73 = uVar73 + 1) {
                          dVar3 = *(double *)((long)pSVar16 + lVar71 + -8);
                          linb::any::
                          construct<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>const&>
                                    ((any *)&err_1,
                                     (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                      *)((long)&pSVar16->t + lVar71));
                          tinyusdz::value::TimeSamples::add_sample
                                    ((TimeSamples *)&toks,dVar3,(Value *)&err_1);
                          if (err_1.field_2._M_allocated_capacity != 0) {
                            (**(code **)(err_1.field_2._M_allocated_capacity + 0x20))(&err_1);
                          }
                          lVar71 = lVar71 + 0x28;
                        }
                        tinyusdz::value::TimeSamples::operator=(&pvar._ts,(TimeSamples *)&toks);
                        ::std::
                        vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                        ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                   *)&toks);
                      }
                      pvVar60 = nonstd::optional_lite::
                                optional<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                                ::value((optional<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                                         *)&ss_e);
                      if (pvVar60->_has_value == false) {
                        pvVar60 = nonstd::optional_lite::
                                  optional<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                                  ::value((optional<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                                           *)&ss_e);
                        bVar18 = Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                                 ::has_timesamples(pvVar60);
                        if (!bVar18) goto LAB_0028bee3;
                      }
                      Attribute::set_var((Attribute *)&ret,&pvar);
                    }
LAB_0028bee3:
                    nonstd::optional_lite::
                    optional<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                    ::~optional((optional<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                                 *)&ss_e);
                  }
                }
                primvar::PrimVar::~PrimVar(&pvar);
                AttrMetas::operator=(&local_818,local_938);
                Property::Property((Property *)&ss_e,(Attribute *)&ret,false);
                Property::operator=(out_prop,(Property *)&ss_e);
                Property::~Property((Property *)&ss_e);
                Attribute::~Attribute((Attribute *)&ret);
              }
            }
LAB_0028bf47:
            ret_1.contained.
            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .m_has_value = true;
            ret_1.contained.
            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .field_0.m_value = true;
          }
LAB_0028bf57:
          ::std::__cxx11::string::_M_dispose();
        }
        if (ret_1.contained.
            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .m_has_value == true) {
          pvVar26 = nonstd::expected_lite::
                    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::value(&ret_1);
          if (*pvVar26 != false) goto LAB_002874c3;
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar27 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar27 = ::std::operator<<(poVar27,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                     );
          poVar27 = ::std::operator<<(poVar27,":");
          poVar27 = ::std::operator<<(poVar27,"GetProperty");
          poVar27 = ::std::operator<<(poVar27,"():");
          poVar27 = (ostream *)::std::ostream::operator<<(poVar27,0x799);
          ::std::operator<<(poVar27," ");
          ::std::__cxx11::string::string
                    ((string *)&pvar,"Attribute `{}` does not exist in Prim {}({})",
                     (allocator *)&ts_1);
          tinyusdz::value::TypeTraits<tinyusdz::SkelAnimation>::type_name_abi_cxx11_();
          fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    ((string *)&ret,(fmt *)&pvar,attr_name,&(prim->_elementPath)._prim_part,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&toks,
                     in_R9);
          poVar27 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
          ::std::operator<<(poVar27,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar27 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar27 = ::std::operator<<(poVar27,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                     );
          poVar27 = ::std::operator<<(poVar27,":");
          poVar27 = ::std::operator<<(poVar27,"GetProperty");
          poVar27 = ::std::operator<<(poVar27,"():");
          poVar27 = (ostream *)::std::ostream::operator<<(poVar27,0x799);
          ::std::operator<<(poVar27," ");
          peVar24 = nonstd::expected_lite::
                    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::error(&ret_1);
          poVar27 = ::std::operator<<((ostream *)&ss_e,(string *)peVar24);
          ::std::operator<<(poVar27,"\n");
        }
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          goto LAB_002876b2;
        }
        goto LAB_002876c2;
      }
      this_00 = Prim::as<tinyusdz::GeomSubset>(prim);
      if (out_prop == (Property *)0x0) {
        _ss_e = "[InternalError] nullptr in output Property is not allowed.";
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::expected<const_char_*,_0>(&ret_1,(unexpected_type<const_char_*> *)&ss_e);
      }
      else {
        err_1._M_dataplus._M_p = (pointer)&err_1.field_2;
        err_1._M_string_length = 0;
        err_1.field_2._M_allocated_capacity =
             err_1.field_2._M_allocated_capacity & 0xffffffffffffff00;
        bVar18 = ::std::operator==(attr_name,"indices");
        if (bVar18) {
          (anonymous_namespace)::ToProperty<std::vector<int,std::allocator<int>>>
                    (&this_00->indices,out_prop,err_00);
        }
        bVar18 = ::std::operator==(attr_name,"elementType");
        if (bVar18) {
          Attribute::Attribute((Attribute *)&ret);
          ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value = true;
          ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._33_3_ = 0;
          ::std::__cxx11::string::string((string *)&ss_e,"token",(allocator *)&pvar);
          ::std::__cxx11::string::_M_assign(local_890);
          ::std::__cxx11::string::_M_dispose();
          if ((this_00->elementType)._blocked == true) {
            local_858 = true;
          }
          if ((this_00->elementType)._paths.
              super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (this_00->elementType)._paths.
              super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_start) {
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      (&local_830,&(this_00->elementType)._paths);
          }
          pEVar31 = TypedAttributeWithFallback<tinyusdz::GeomSubset::ElementType>::get_value
                              (&this_00->elementType);
          pvar._value.v_.storage._8_8_ = 0;
          pvar._value.v_.vtable._0_1_ = 0;
          pvar._value.v_.vtable._1_7_ = 0;
          pvar._blocked = false;
          pvar._25_7_ = 0;
          pvar._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
          local_600._M_allocated_capacity =
               (size_type)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
          _ss_e = (char *)0x0;
          pvar._value.v_.storage._4_2_ = 1;
          pvar._value.v_.storage._0_4_ = *pEVar31;
          local_600._8_8_ = local_600._8_8_ & 0xffffffffffffff00;
          local_5f0[0]._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_5f0[0]._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
          local_5f0[0]._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
          local_5f0[0]._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          local_5f0[0]._17_8_ = 0;
          tinyusdz::to_string_abi_cxx11_((string *)&ts_1,(tinyusdz *)(ulong)*pEVar31,v);
          Token::Token((Token *)&toks,(string *)&ts_1);
          ::std::__cxx11::string::_M_dispose();
          linb::any::construct<tinyusdz::Token_const&>((any *)&ts_1,(Token *)&toks);
          linb::any::operator=((any *)&ss_e,(any *)&ts_1);
          if (CONCAT71(ts_1._samples.
                       super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                       ts_1._samples.
                       super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) != 0) {
            (**(code **)(CONCAT71(ts_1._samples.
                                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                  ts_1._samples.
                                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) + 0x20))
                      (&ts_1);
          }
          ::std::__cxx11::string::_M_dispose();
          Attribute::set_var((Attribute *)&ret,(PrimVar *)&ss_e);
          primvar::PrimVar::~PrimVar((PrimVar *)&ss_e);
          ::std::
          _Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::GeomSubset::ElementType>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::GeomSubset::ElementType>::Sample>_>
          ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::GeomSubset::ElementType>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::GeomSubset::ElementType>::Sample>_>
                           *)((long)&pvar._value.v_.storage + 8));
          AttrMetas::operator=(&local_818,&(this_00->elementType)._metas);
          Property::Property((Property *)&ss_e,(Attribute *)&ret,false);
          Property::operator=(out_prop,(Property *)&ss_e);
          Property::~Property((Property *)&ss_e);
          Attribute::~Attribute((Attribute *)&ret);
        }
        bVar18 = ::std::operator==(attr_name,"familyName");
        if (bVar18) {
          Attribute::Attribute((Attribute *)&ret);
          ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value = true;
          ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._33_3_ = 0;
          tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
          ::std::__cxx11::string::_M_assign(local_890);
          ::std::__cxx11::string::_M_dispose();
          if ((this_00->familyName)._blocked == true) {
            local_858 = true;
          }
          if ((this_00->familyName)._paths.
              super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (this_00->familyName)._paths.
              super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_start) {
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      (&local_830,&(this_00->familyName)._paths);
          }
          if ((this_00->familyName)._attrib.has_value_ != true) {
LAB_00288120:
            AttrMetas::operator=(&local_818,&(this_00->familyName)._metas);
            Property::Property((Property *)&ss_e,(Attribute *)&ret,false);
            Property::operator=(out_prop,(Property *)&ss_e);
            Property::~Property((Property *)&ss_e);
            Attribute::~Attribute((Attribute *)&ret);
            goto LAB_0028816e;
          }
          nonstd::optional_lite::optional<tinyusdz::Token>::optional
                    ((optional<tinyusdz::Token> *)&pvar,&(this_00->familyName)._attrib);
          uVar72 = pvar._value.v_.storage._0_1_;
          if (pvar._value.v_.storage._0_1_ == '\x01') {
            value = nonstd::optional_lite::optional<tinyusdz::Token>::value
                              ((optional<tinyusdz::Token> *)&pvar);
            linb::any::construct<tinyusdz::Token_const&>((any *)&toks,value);
            local_600._M_allocated_capacity =
                 (size_type)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
            _ss_e = (char *)0x0;
            local_600._8_8_ = local_600._8_8_ & 0xffffffffffffff00;
            local_5f0[0]._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_5f0[0]._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
            local_5f0[0]._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
            local_5f0[0]._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
            local_5f0[0]._17_8_ = 0;
            linb::any::operator=((any *)&ss_e,(any *)&toks);
            Attribute::set_var((Attribute *)&ret,(PrimVar *)&ss_e);
            primvar::PrimVar::~PrimVar((PrimVar *)&ss_e);
            if (CONCAT71(toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                         toks.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) != 0) {
              (**(code **)(CONCAT71(toks.
                                    super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                    toks.
                                    super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) + 0x20
                          ))(&toks);
            }
          }
          else {
            ::std::__cxx11::string::string
                      ((string *)&toks,"[InternalError] Invalid TypedAttribute<{}> value.",
                       &local_929);
            tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
            fmt::format<std::__cxx11::string>
                      ((string *)&ss_e,(fmt *)&toks,(string *)&ts_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar66)
            ;
            ::std::__cxx11::string::append((string *)&err_1);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          nonstd::optional_lite::optional<tinyusdz::Token>::~optional
                    ((optional<tinyusdz::Token> *)&pvar);
          if (uVar72 != '\0') goto LAB_00288120;
          Attribute::~Attribute((Attribute *)&ret);
          ::std::__cxx11::string::string
                    ((string *)&pvar,"Convert Property {} failed: {}\n",(allocator *)&toks);
          fmt::format<char[11],std::__cxx11::string>
                    ((string *)&ret,(fmt *)&pvar,(string *)"familyName",(char (*) [11])&err_1,in_R8)
          ;
          _ss_e = (char *)&local_600;
          _Var2._M_p = (pointer)((long)&ret.contained.
                                        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        .field_0 + 0x10);
          if (ret.contained.
              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0.m_error._M_dataplus._M_p == (_Alloc_hider)_Var2._M_p) {
            local_600._8_8_ =
                 ret.contained.
                 super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .field_0._24_8_;
          }
          else {
            _ss_e = (char *)ret.contained.
                            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            .field_0.m_error._M_dataplus._M_p;
          }
          local_600._M_allocated_capacity._1_7_ =
               ret.contained.
               super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0._17_7_;
          local_600._M_local_buf[0] =
               ret.contained.
               super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0._16_1_;
          ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .field_0.m_error._M_string_length = 0;
          ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .field_0._16_1_ = 0;
          ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .field_0.m_error._M_dataplus._M_p = (_Alloc_hider)_Var2._M_p;
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&ret_1,(unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&ss_e);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        else {
LAB_0028816e:
          bVar18 = ::std::operator==(attr_name,"material:binding");
          if (bVar18) {
            if ((this_00->super_MaterialBinding).materialBinding.has_value_ != true) {
LAB_002881fc:
              ret_1.contained.
              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .m_has_value = true;
              ret_1.contained.
              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0.m_error._M_dataplus._M_p =
                   (_Alloc_hider)
                   ((ulong)ret_1.contained.
                           super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .field_0.m_error._M_dataplus._M_p & 0xffffffffffffff00);
              goto LAB_002886d2;
            }
            pvVar53 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                                ((optional<tinyusdz::Relationship> *)this_00);
            Property::Property((Property *)&ss_e,pvVar53,false);
            Property::operator=(out_prop,(Property *)&ss_e);
            Property::~Property((Property *)&ss_e);
          }
          else {
            cVar23 = ::std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                             *)&this_00->props,attr_name);
            if ((_Rb_tree_header *)cVar23._M_node ==
                &(this_00->props)._M_t._M_impl.super__Rb_tree_header) goto LAB_002881fc;
            Property::operator=(out_prop,(Property *)(cVar23._M_node + 2));
          }
          ret_1.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value = true;
          ret_1.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .field_0.m_value = true;
        }
LAB_002886d2:
        ::std::__cxx11::string::_M_dispose();
      }
      if (ret_1.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar26 = nonstd::expected_lite::
                  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::value(&ret_1);
        if (*pvVar26 != false) goto LAB_002874c3;
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar27 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar27 = ::std::operator<<(poVar27,
                                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                   );
        poVar27 = ::std::operator<<(poVar27,":");
        poVar27 = ::std::operator<<(poVar27,"GetProperty");
        poVar27 = ::std::operator<<(poVar27,"():");
        poVar27 = (ostream *)::std::ostream::operator<<(poVar27,0x793);
        ::std::operator<<(poVar27," ");
        ::std::__cxx11::string::string
                  ((string *)&pvar,"Attribute `{}` does not exist in Prim {}({})",(allocator *)&ts_1
                  );
        tinyusdz::value::TypeTraits<tinyusdz::GeomSubset>::type_name_abi_cxx11_();
        goto LAB_00287641;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar27 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar27 = ::std::operator<<(poVar27,
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                 );
      poVar27 = ::std::operator<<(poVar27,":");
      poVar27 = ::std::operator<<(poVar27,"GetProperty");
      poVar27 = ::std::operator<<(poVar27,"():");
      iVar68 = 0x793;
      goto LAB_00287533;
    }
    pSVar25 = Prim::as<tinyusdz::Scope>(prim);
    if (out_prop == (Property *)0x0) {
      _ss_e = "[InternalError] nullptr in output Property is not allowed.";
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::expected<const_char_*,_0>(&ret,(unexpected_type<const_char_*> *)&ss_e);
      if ((ret.contained.
           super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._32_4_ & 1) == 0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar27 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar27 = ::std::operator<<(poVar27,
                                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                   );
        poVar27 = ::std::operator<<(poVar27,":");
        poVar27 = ::std::operator<<(poVar27,"GetProperty");
        poVar27 = ::std::operator<<(poVar27,"():");
        iVar68 = 0x791;
        goto LAB_002868c4;
      }
    }
    else {
      cVar23 = ::std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                       *)&pSVar25->props,attr_name);
      if ((_Rb_tree_header *)cVar23._M_node == &(pSVar25->props)._M_t._M_impl.super__Rb_tree_header)
      {
        ret.contained.
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .m_has_value = true;
        ret.contained.
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_error._M_dataplus._M_p =
             (_Alloc_hider)
             ((ulong)ret.contained.
                     super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .field_0.m_error._M_dataplus._M_p & 0xffffffffffffff00);
      }
      else {
        Property::operator=(out_prop,(Property *)(cVar23._M_node + 2));
        ret.contained.
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .m_has_value = true;
        ret.contained.
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_value = true;
      }
    }
    pvVar26 = nonstd::expected_lite::
              expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::value(&ret);
    if (*pvVar26 != false) goto LAB_002869bb;
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar27 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar27 = ::std::operator<<(poVar27,
                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                               );
    poVar27 = ::std::operator<<(poVar27,":");
    poVar27 = ::std::operator<<(poVar27,"GetProperty");
    poVar27 = ::std::operator<<(poVar27,"():");
    poVar27 = (ostream *)::std::ostream::operator<<(poVar27,0x791);
    ::std::operator<<(poVar27," ");
    ::std::__cxx11::string::string
              ((string *)&ret_1,"Attribute `{}` does not exist in Prim {}({})",(allocator *)&ts_1);
    tinyusdz::value::TypeTraits<tinyusdz::Scope>::type_name_abi_cxx11_();
    fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              ((string *)&pvar,(fmt *)&ret_1,attr_name,&(prim->_elementPath)._prim_part,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&toks,in_R9);
LAB_00286a98:
    poVar27 = ::std::operator<<((ostream *)&ss_e,(string *)&pvar);
    ::std::operator<<(poVar27,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
LAB_00286ae4:
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
    }
  }
LAB_00286af4:
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
  pPVar69 = (PrimVar *)&ret;
LAB_002876d7:
  nonstd::expected_lite::
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pPVar69);
  return false;
}

Assistant:

bool GetProperty(const tinyusdz::Prim &prim, const std::string &attr_name,
                 Property *out_prop, std::string *err) {
#define GET_PRIM_PROPERTY(__ty)                                         \
  if (prim.is<__ty>()) {                                                \
    auto ret = GetPrimProperty(*prim.as<__ty>(), attr_name, out_prop);  \
    if (ret) {                                                          \
      if (!ret.value()) {                                               \
        PUSH_ERROR_AND_RETURN(                                          \
            fmt::format("Attribute `{}` does not exist in Prim {}({})", \
                        attr_name, prim.element_path().prim_part(),     \
                        value::TypeTraits<__ty>::type_name()));         \
      }                                                                 \
    } else {                                                            \
      PUSH_ERROR_AND_RETURN(ret.error());                               \
    }                                                                   \
  } else

  GET_PRIM_PROPERTY(Model)
  GET_PRIM_PROPERTY(Xform)
  GET_PRIM_PROPERTY(Scope)
  GET_PRIM_PROPERTY(GeomMesh)
  GET_PRIM_PROPERTY(GeomSubset)
  GET_PRIM_PROPERTY(Shader)
  GET_PRIM_PROPERTY(Material)
  GET_PRIM_PROPERTY(SkelRoot)
  GET_PRIM_PROPERTY(BlendShape)
  GET_PRIM_PROPERTY(Skeleton)
  GET_PRIM_PROPERTY(SkelAnimation) {
    PUSH_ERROR_AND_RETURN("TODO: Prim type " << prim.type_name());
  }

#undef GET_PRIM_PROPERTY

  return true;
}